

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::sse2::CurveNiIntersector1<4>::
     occluded_t<embree::sse2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::sse2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Primitive *pPVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Primitive PVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined6 uVar28;
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  vfloat_impl<4> vVar44;
  int iVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  StackEntry *pSVar48;
  ulong extraout_RAX;
  long extraout_RAX_00;
  long lVar49;
  RTCFilterFunctionN p_Var50;
  int iVar51;
  RayQueryContext *pRVar52;
  RayQueryContext *pRVar53;
  RayQueryContext *pRVar54;
  RayQueryContext *extraout_RDX;
  RayQueryContext *extraout_RDX_00;
  RayQueryContext *extraout_RDX_01;
  RayQueryContext *extraout_RDX_02;
  RayQueryContext *extraout_RDX_03;
  RayQueryContext *extraout_RDX_04;
  byte bVar55;
  RayQueryContext *pRVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  bool bVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  short sVar65;
  float fVar66;
  float fVar107;
  float fVar108;
  vfloat4 a;
  undefined2 uVar106;
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float pp;
  float fVar109;
  float fVar131;
  float fVar132;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar133;
  float fVar134;
  float fVar140;
  float fVar141;
  vfloat4 v;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar142;
  float fVar143;
  float fVar161;
  float fVar163;
  vfloat4 v_1;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar162;
  float fVar164;
  float fVar165;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar166;
  float fVar174;
  float fVar175;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar176;
  float fVar177;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar178;
  float fVar203;
  float fVar205;
  undefined1 auVar180 [16];
  undefined1 auVar183 [16];
  undefined1 auVar186 [16];
  undefined1 auVar189 [16];
  undefined1 auVar192 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar179;
  float fVar204;
  float fVar206;
  float fVar207;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar208;
  float fVar223;
  float fVar225;
  __m128 a_1;
  undefined1 auVar210 [16];
  undefined1 auVar213 [16];
  float fVar209;
  float fVar224;
  float fVar226;
  float fVar227;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar222 [16];
  float fVar228;
  float fVar232;
  float fVar234;
  undefined1 auVar229 [16];
  float fVar233;
  float fVar235;
  float fVar236;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar237;
  float fVar250;
  float fVar251;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar246;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar252;
  float fVar253;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar262;
  float fVar263;
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  undefined1 auVar264 [16];
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar282;
  float fVar285;
  __m128 a_2;
  float fVar288;
  undefined1 auVar278 [16];
  float fVar283;
  float fVar284;
  float fVar286;
  float fVar287;
  float fVar289;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar298;
  float fVar302;
  float fVar306;
  undefined1 auVar294 [16];
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar307;
  float fVar308;
  float fVar309;
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  float fVar310;
  float fVar311;
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  float fVar319;
  float fVar330;
  float fVar331;
  float fVar332;
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar329 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  uint local_61c;
  undefined1 local_608 [8];
  float fStack_600;
  float fStack_5fc;
  undefined1 local_5d8 [8];
  float fStack_5d0;
  float fStack_5cc;
  undefined8 local_568;
  int local_54c;
  RTCFilterFunctionNArguments args;
  undefined1 local_518 [8];
  float fStack_510;
  float fStack_50c;
  vfloatx vu0;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_348 [16];
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [16];
  Primitive *local_2f8;
  ulong local_2f0;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [16];
  BBox<embree::vfloat_impl<4>_> tp1;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  BBox<embree::vfloat_impl<4>_> tp0;
  float local_118 [4];
  undefined1 local_108 [16];
  StackEntry stack [4];
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 uVar105;
  undefined1 auVar173 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar221 [16];
  undefined1 auVar247 [16];
  undefined1 auVar328 [16];
  
  PVar8 = prim[1];
  uVar58 = (ulong)(byte)PVar8;
  pPVar5 = prim + uVar58 * 0x19 + 6;
  fVar141 = *(float *)(pPVar5 + 0xc);
  fVar142 = ((ray->org).field_0.m128[0] - *(float *)pPVar5) * fVar141;
  fVar161 = ((ray->org).field_0.m128[1] - *(float *)(pPVar5 + 4)) * fVar141;
  fVar163 = ((ray->org).field_0.m128[2] - *(float *)(pPVar5 + 8)) * fVar141;
  fVar133 = fVar141 * (ray->dir).field_0.m128[0];
  fVar140 = fVar141 * (ray->dir).field_0.m128[1];
  fVar141 = fVar141 * (ray->dir).field_0.m128[2];
  uVar47 = *(undefined4 *)(prim + uVar58 * 4 + 6);
  uVar105 = (undefined1)((uint)uVar47 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar47 >> 0x10);
  uVar15 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar47));
  uVar105 = (undefined1)((uint)uVar47 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar15 >> 0x20),uVar105),uVar105);
  sVar65 = CONCAT11((char)uVar47,(char)uVar47);
  uVar57 = CONCAT62(uVar28,sVar65);
  auVar198._8_4_ = 0;
  auVar198._0_8_ = uVar57;
  auVar198._12_2_ = uVar106;
  auVar198._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar15 >> 0x20);
  auVar240._12_4_ = auVar198._12_4_;
  auVar240._8_2_ = 0;
  auVar240._0_8_ = uVar57;
  auVar240._10_2_ = uVar106;
  auVar75._10_6_ = auVar240._10_6_;
  auVar75._8_2_ = uVar106;
  auVar75._0_8_ = uVar57;
  uVar106 = (undefined2)uVar28;
  auVar29._4_8_ = auVar75._8_8_;
  auVar29._2_2_ = uVar106;
  auVar29._0_2_ = uVar106;
  fVar109 = (float)((int)sVar65 >> 8);
  fVar131 = (float)(auVar29._0_4_ >> 0x18);
  fVar132 = (float)(auVar75._8_4_ >> 0x18);
  uVar47 = *(undefined4 *)(prim + uVar58 * 5 + 6);
  uVar105 = (undefined1)((uint)uVar47 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar47 >> 0x10);
  uVar15 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar47));
  uVar105 = (undefined1)((uint)uVar47 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar15 >> 0x20),uVar105),uVar105);
  sVar65 = CONCAT11((char)uVar47,(char)uVar47);
  uVar57 = CONCAT62(uVar28,sVar65);
  auVar215._8_4_ = 0;
  auVar215._0_8_ = uVar57;
  auVar215._12_2_ = uVar106;
  auVar215._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar15 >> 0x20);
  auVar68._12_4_ = auVar215._12_4_;
  auVar68._8_2_ = 0;
  auVar68._0_8_ = uVar57;
  auVar68._10_2_ = uVar106;
  auVar67._10_6_ = auVar68._10_6_;
  auVar67._8_2_ = uVar106;
  auVar67._0_8_ = uVar57;
  uVar106 = (undefined2)uVar28;
  auVar30._4_8_ = auVar67._8_8_;
  auVar30._2_2_ = uVar106;
  auVar30._0_2_ = uVar106;
  fVar166 = (float)((int)sVar65 >> 8);
  fVar174 = (float)(auVar30._0_4_ >> 0x18);
  fVar175 = (float)(auVar67._8_4_ >> 0x18);
  uVar47 = *(undefined4 *)(prim + uVar58 * 6 + 6);
  uVar105 = (undefined1)((uint)uVar47 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar47 >> 0x10);
  uVar15 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar47));
  uVar105 = (undefined1)((uint)uVar47 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar15 >> 0x20),uVar105),uVar105);
  sVar65 = CONCAT11((char)uVar47,(char)uVar47);
  uVar57 = CONCAT62(uVar28,sVar65);
  auVar71._8_4_ = 0;
  auVar71._0_8_ = uVar57;
  auVar71._12_2_ = uVar106;
  auVar71._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar15 >> 0x20);
  auVar70._12_4_ = auVar71._12_4_;
  auVar70._8_2_ = 0;
  auVar70._0_8_ = uVar57;
  auVar70._10_2_ = uVar106;
  auVar69._10_6_ = auVar70._10_6_;
  auVar69._8_2_ = uVar106;
  auVar69._0_8_ = uVar57;
  uVar106 = (undefined2)uVar28;
  auVar31._4_8_ = auVar69._8_8_;
  auVar31._2_2_ = uVar106;
  auVar31._0_2_ = uVar106;
  fVar228 = (float)((int)sVar65 >> 8);
  fVar232 = (float)(auVar31._0_4_ >> 0x18);
  fVar234 = (float)(auVar69._8_4_ >> 0x18);
  uVar47 = *(undefined4 *)(prim + uVar58 * 0xb + 6);
  uVar105 = (undefined1)((uint)uVar47 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar47 >> 0x10);
  uVar15 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar47));
  uVar105 = (undefined1)((uint)uVar47 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar15 >> 0x20),uVar105),uVar105);
  sVar65 = CONCAT11((char)uVar47,(char)uVar47);
  uVar57 = CONCAT62(uVar28,sVar65);
  auVar74._8_4_ = 0;
  auVar74._0_8_ = uVar57;
  auVar74._12_2_ = uVar106;
  auVar74._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar15 >> 0x20);
  auVar73._12_4_ = auVar74._12_4_;
  auVar73._8_2_ = 0;
  auVar73._0_8_ = uVar57;
  auVar73._10_2_ = uVar106;
  auVar72._10_6_ = auVar73._10_6_;
  auVar72._8_2_ = uVar106;
  auVar72._0_8_ = uVar57;
  uVar106 = (undefined2)uVar28;
  auVar32._4_8_ = auVar72._8_8_;
  auVar32._2_2_ = uVar106;
  auVar32._0_2_ = uVar106;
  fVar66 = (float)((int)sVar65 >> 8);
  fVar107 = (float)(auVar32._0_4_ >> 0x18);
  fVar108 = (float)(auVar72._8_4_ >> 0x18);
  uVar47 = *(undefined4 *)(prim + uVar58 * 0xc + 6);
  uVar105 = (undefined1)((uint)uVar47 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar47 >> 0x10);
  uVar15 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar47));
  uVar105 = (undefined1)((uint)uVar47 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar15 >> 0x20),uVar105),uVar105);
  sVar65 = CONCAT11((char)uVar47,(char)uVar47);
  uVar57 = CONCAT62(uVar28,sVar65);
  auVar182._8_4_ = 0;
  auVar182._0_8_ = uVar57;
  auVar182._12_2_ = uVar106;
  auVar182._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar15 >> 0x20);
  auVar181._12_4_ = auVar182._12_4_;
  auVar181._8_2_ = 0;
  auVar181._0_8_ = uVar57;
  auVar181._10_2_ = uVar106;
  auVar180._10_6_ = auVar181._10_6_;
  auVar180._8_2_ = uVar106;
  auVar180._0_8_ = uVar57;
  uVar106 = (undefined2)uVar28;
  auVar33._4_8_ = auVar180._8_8_;
  auVar33._2_2_ = uVar106;
  auVar33._0_2_ = uVar106;
  fVar208 = (float)((int)sVar65 >> 8);
  fVar223 = (float)(auVar33._0_4_ >> 0x18);
  fVar225 = (float)(auVar180._8_4_ >> 0x18);
  uVar47 = *(undefined4 *)(prim + uVar58 * 0xd + 6);
  uVar105 = (undefined1)((uint)uVar47 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar47 >> 0x10);
  uVar15 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar47));
  uVar105 = (undefined1)((uint)uVar47 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar15 >> 0x20),uVar105),uVar105);
  sVar65 = CONCAT11((char)uVar47,(char)uVar47);
  uVar57 = CONCAT62(uVar28,sVar65);
  auVar185._8_4_ = 0;
  auVar185._0_8_ = uVar57;
  auVar185._12_2_ = uVar106;
  auVar185._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar15 >> 0x20);
  auVar184._12_4_ = auVar185._12_4_;
  auVar184._8_2_ = 0;
  auVar184._0_8_ = uVar57;
  auVar184._10_2_ = uVar106;
  auVar183._10_6_ = auVar184._10_6_;
  auVar183._8_2_ = uVar106;
  auVar183._0_8_ = uVar57;
  uVar106 = (undefined2)uVar28;
  auVar34._4_8_ = auVar183._8_8_;
  auVar34._2_2_ = uVar106;
  auVar34._0_2_ = uVar106;
  fVar252 = (float)((int)sVar65 >> 8);
  fVar257 = (float)(auVar34._0_4_ >> 0x18);
  fVar259 = (float)(auVar183._8_4_ >> 0x18);
  uVar47 = *(undefined4 *)(prim + uVar58 * 0x12 + 6);
  uVar105 = (undefined1)((uint)uVar47 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar47 >> 0x10);
  uVar15 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar47));
  uVar105 = (undefined1)((uint)uVar47 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar15 >> 0x20),uVar105),uVar105);
  sVar65 = CONCAT11((char)uVar47,(char)uVar47);
  uVar57 = CONCAT62(uVar28,sVar65);
  auVar188._8_4_ = 0;
  auVar188._0_8_ = uVar57;
  auVar188._12_2_ = uVar106;
  auVar188._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar15 >> 0x20);
  auVar187._12_4_ = auVar188._12_4_;
  auVar187._8_2_ = 0;
  auVar187._0_8_ = uVar57;
  auVar187._10_2_ = uVar106;
  auVar186._10_6_ = auVar187._10_6_;
  auVar186._8_2_ = uVar106;
  auVar186._0_8_ = uVar57;
  uVar106 = (undefined2)uVar28;
  auVar35._4_8_ = auVar186._8_8_;
  auVar35._2_2_ = uVar106;
  auVar35._0_2_ = uVar106;
  fVar237 = (float)((int)sVar65 >> 8);
  fVar250 = (float)(auVar35._0_4_ >> 0x18);
  fVar251 = (float)(auVar186._8_4_ >> 0x18);
  uVar47 = *(undefined4 *)(prim + uVar58 * 0x13 + 6);
  uVar105 = (undefined1)((uint)uVar47 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar47 >> 0x10);
  uVar15 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar47));
  uVar105 = (undefined1)((uint)uVar47 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar15 >> 0x20),uVar105),uVar105);
  sVar65 = CONCAT11((char)uVar47,(char)uVar47);
  uVar57 = CONCAT62(uVar28,sVar65);
  auVar191._8_4_ = 0;
  auVar191._0_8_ = uVar57;
  auVar191._12_2_ = uVar106;
  auVar191._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar15 >> 0x20);
  auVar190._12_4_ = auVar191._12_4_;
  auVar190._8_2_ = 0;
  auVar190._0_8_ = uVar57;
  auVar190._10_2_ = uVar106;
  auVar189._10_6_ = auVar190._10_6_;
  auVar189._8_2_ = uVar106;
  auVar189._0_8_ = uVar57;
  uVar106 = (undefined2)uVar28;
  auVar36._4_8_ = auVar189._8_8_;
  auVar36._2_2_ = uVar106;
  auVar36._0_2_ = uVar106;
  fVar262 = (float)((int)sVar65 >> 8);
  fVar265 = (float)(auVar36._0_4_ >> 0x18);
  fVar267 = (float)(auVar189._8_4_ >> 0x18);
  uVar47 = *(undefined4 *)(prim + uVar58 * 0x14 + 6);
  uVar105 = (undefined1)((uint)uVar47 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar47 >> 0x10);
  uVar15 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar47));
  uVar105 = (undefined1)((uint)uVar47 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar15 >> 0x20),uVar105),uVar105);
  sVar65 = CONCAT11((char)uVar47,(char)uVar47);
  uVar57 = CONCAT62(uVar28,sVar65);
  auVar194._8_4_ = 0;
  auVar194._0_8_ = uVar57;
  auVar194._12_2_ = uVar106;
  auVar194._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar15 >> 0x20);
  auVar193._12_4_ = auVar194._12_4_;
  auVar193._8_2_ = 0;
  auVar193._0_8_ = uVar57;
  auVar193._10_2_ = uVar106;
  auVar192._10_6_ = auVar193._10_6_;
  auVar192._8_2_ = uVar106;
  auVar192._0_8_ = uVar57;
  uVar106 = (undefined2)uVar28;
  auVar37._4_8_ = auVar192._8_8_;
  auVar37._2_2_ = uVar106;
  auVar37._0_2_ = uVar106;
  fVar310 = (float)((int)sVar65 >> 8);
  fVar314 = (float)(auVar37._0_4_ >> 0x18);
  fVar316 = (float)(auVar192._8_4_ >> 0x18);
  fVar290 = fVar133 * fVar109 + fVar140 * fVar166 + fVar141 * fVar228;
  fVar298 = fVar133 * fVar131 + fVar140 * fVar174 + fVar141 * fVar232;
  fVar302 = fVar133 * fVar132 + fVar140 * fVar175 + fVar141 * fVar234;
  fVar306 = fVar133 * (float)(auVar240._12_4_ >> 0x18) +
            fVar140 * (float)(auVar68._12_4_ >> 0x18) + fVar141 * (float)(auVar70._12_4_ >> 0x18);
  fVar275 = fVar133 * fVar66 + fVar140 * fVar208 + fVar141 * fVar252;
  fVar282 = fVar133 * fVar107 + fVar140 * fVar223 + fVar141 * fVar257;
  fVar285 = fVar133 * fVar108 + fVar140 * fVar225 + fVar141 * fVar259;
  fVar288 = fVar133 * (float)(auVar73._12_4_ >> 0x18) +
            fVar140 * (float)(auVar181._12_4_ >> 0x18) + fVar141 * (float)(auVar184._12_4_ >> 0x18);
  fVar178 = fVar133 * fVar237 + fVar140 * fVar262 + fVar141 * fVar310;
  fVar203 = fVar133 * fVar250 + fVar140 * fVar265 + fVar141 * fVar314;
  fVar205 = fVar133 * fVar251 + fVar140 * fVar267 + fVar141 * fVar316;
  fVar133 = fVar133 * (float)(auVar187._12_4_ >> 0x18) +
            fVar140 * (float)(auVar190._12_4_ >> 0x18) + fVar141 * (float)(auVar193._12_4_ >> 0x18);
  fVar166 = fVar109 * fVar142 + fVar166 * fVar161 + fVar228 * fVar163;
  fVar174 = fVar131 * fVar142 + fVar174 * fVar161 + fVar232 * fVar163;
  fVar175 = fVar132 * fVar142 + fVar175 * fVar161 + fVar234 * fVar163;
  fVar228 = (float)(auVar240._12_4_ >> 0x18) * fVar142 +
            (float)(auVar68._12_4_ >> 0x18) * fVar161 + (float)(auVar70._12_4_ >> 0x18) * fVar163;
  fVar234 = fVar66 * fVar142 + fVar208 * fVar161 + fVar252 * fVar163;
  fVar252 = fVar107 * fVar142 + fVar223 * fVar161 + fVar257 * fVar163;
  fVar257 = fVar108 * fVar142 + fVar225 * fVar161 + fVar259 * fVar163;
  fVar259 = (float)(auVar73._12_4_ >> 0x18) * fVar142 +
            (float)(auVar181._12_4_ >> 0x18) * fVar161 + (float)(auVar184._12_4_ >> 0x18) * fVar163;
  fVar208 = fVar142 * fVar237 + fVar161 * fVar262 + fVar163 * fVar310;
  fVar223 = fVar142 * fVar250 + fVar161 * fVar265 + fVar163 * fVar314;
  fVar225 = fVar142 * fVar251 + fVar161 * fVar267 + fVar163 * fVar316;
  fVar232 = fVar142 * (float)(auVar187._12_4_ >> 0x18) +
            fVar161 * (float)(auVar190._12_4_ >> 0x18) + fVar163 * (float)(auVar193._12_4_ >> 0x18);
  fVar141 = (float)DAT_01f4bd50;
  fVar66 = DAT_01f4bd50._4_4_;
  fVar107 = DAT_01f4bd50._8_4_;
  fVar108 = DAT_01f4bd50._12_4_;
  uVar61 = -(uint)(fVar141 <= ABS(fVar290));
  uVar62 = -(uint)(fVar66 <= ABS(fVar298));
  uVar63 = -(uint)(fVar107 <= ABS(fVar302));
  uVar64 = -(uint)(fVar108 <= ABS(fVar306));
  auVar294._0_4_ = (uint)fVar290 & uVar61;
  auVar294._4_4_ = (uint)fVar298 & uVar62;
  auVar294._8_4_ = (uint)fVar302 & uVar63;
  auVar294._12_4_ = (uint)fVar306 & uVar64;
  auVar144._0_4_ = ~uVar61 & (uint)fVar141;
  auVar144._4_4_ = ~uVar62 & (uint)fVar66;
  auVar144._8_4_ = ~uVar63 & (uint)fVar107;
  auVar144._12_4_ = ~uVar64 & (uint)fVar108;
  auVar144 = auVar144 | auVar294;
  uVar61 = -(uint)(fVar141 <= ABS(fVar275));
  uVar62 = -(uint)(fVar66 <= ABS(fVar282));
  uVar63 = -(uint)(fVar107 <= ABS(fVar285));
  uVar64 = -(uint)(fVar108 <= ABS(fVar288));
  auVar278._0_4_ = (uint)fVar275 & uVar61;
  auVar278._4_4_ = (uint)fVar282 & uVar62;
  auVar278._8_4_ = (uint)fVar285 & uVar63;
  auVar278._12_4_ = (uint)fVar288 & uVar64;
  auVar167._0_4_ = ~uVar61 & (uint)fVar141;
  auVar167._4_4_ = ~uVar62 & (uint)fVar66;
  auVar167._8_4_ = ~uVar63 & (uint)fVar107;
  auVar167._12_4_ = ~uVar64 & (uint)fVar108;
  auVar167 = auVar167 | auVar278;
  uVar61 = -(uint)(fVar141 <= ABS(fVar178));
  uVar62 = -(uint)(fVar66 <= ABS(fVar203));
  uVar63 = -(uint)(fVar107 <= ABS(fVar205));
  uVar64 = -(uint)(fVar108 <= ABS(fVar133));
  auVar195._0_4_ = (uint)fVar178 & uVar61;
  auVar195._4_4_ = (uint)fVar203 & uVar62;
  auVar195._8_4_ = (uint)fVar205 & uVar63;
  auVar195._12_4_ = (uint)fVar133 & uVar64;
  auVar238._0_4_ = ~uVar61 & (uint)fVar141;
  auVar238._4_4_ = ~uVar62 & (uint)fVar66;
  auVar238._8_4_ = ~uVar63 & (uint)fVar107;
  auVar238._12_4_ = ~uVar64 & (uint)fVar108;
  auVar238 = auVar238 | auVar195;
  auVar75 = rcpps(_DAT_01f4bd50,auVar144);
  fVar141 = auVar75._0_4_;
  fVar108 = auVar75._4_4_;
  fVar132 = auVar75._8_4_;
  fVar142 = auVar75._12_4_;
  fVar141 = (1.0 - auVar144._0_4_ * fVar141) * fVar141 + fVar141;
  fVar108 = (1.0 - auVar144._4_4_ * fVar108) * fVar108 + fVar108;
  fVar132 = (1.0 - auVar144._8_4_ * fVar132) * fVar132 + fVar132;
  fVar142 = (1.0 - auVar144._12_4_ * fVar142) * fVar142 + fVar142;
  auVar75 = rcpps(auVar75,auVar167);
  fVar66 = auVar75._0_4_;
  fVar109 = auVar75._4_4_;
  fVar133 = auVar75._8_4_;
  fVar161 = auVar75._12_4_;
  fVar66 = (1.0 - auVar167._0_4_ * fVar66) * fVar66 + fVar66;
  fVar109 = (1.0 - auVar167._4_4_ * fVar109) * fVar109 + fVar109;
  fVar133 = (1.0 - auVar167._8_4_ * fVar133) * fVar133 + fVar133;
  fVar161 = (1.0 - auVar167._12_4_ * fVar161) * fVar161 + fVar161;
  auVar75 = rcpps(auVar75,auVar238);
  fVar107 = auVar75._0_4_;
  fVar131 = auVar75._4_4_;
  fVar140 = auVar75._8_4_;
  fVar163 = auVar75._12_4_;
  fVar107 = (1.0 - auVar238._0_4_ * fVar107) * fVar107 + fVar107;
  fVar131 = (1.0 - auVar238._4_4_ * fVar131) * fVar131 + fVar131;
  fVar140 = (1.0 - auVar238._8_4_ * fVar140) * fVar140 + fVar140;
  fVar163 = (1.0 - auVar238._12_4_ * fVar163) * fVar163 + fVar163;
  uVar57 = *(ulong *)(prim + uVar58 * 7 + 6);
  uVar106 = (undefined2)(uVar57 >> 0x30);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar57;
  auVar78._12_2_ = uVar106;
  auVar78._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar57 >> 0x20);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar57;
  auVar77._10_2_ = uVar106;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._8_2_ = uVar106;
  auVar76._0_8_ = uVar57;
  uVar106 = (undefined2)(uVar57 >> 0x10);
  auVar38._4_8_ = auVar76._8_8_;
  auVar38._2_2_ = uVar106;
  auVar38._0_2_ = uVar106;
  auVar145._0_8_ =
       CONCAT44(((float)(auVar38._0_4_ >> 0x10) - fVar174) * fVar108,
                ((float)(int)(short)uVar57 - fVar166) * fVar141);
  auVar145._8_4_ = ((float)(auVar76._8_4_ >> 0x10) - fVar175) * fVar132;
  auVar145._12_4_ = ((float)(auVar77._12_4_ >> 0x10) - fVar228) * fVar142;
  uVar57 = *(ulong *)(prim + uVar58 * 9 + 6);
  uVar106 = (undefined2)(uVar57 >> 0x30);
  auVar81._8_4_ = 0;
  auVar81._0_8_ = uVar57;
  auVar81._12_2_ = uVar106;
  auVar81._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar57 >> 0x20);
  auVar80._12_4_ = auVar81._12_4_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = uVar57;
  auVar80._10_2_ = uVar106;
  auVar79._10_6_ = auVar80._10_6_;
  auVar79._8_2_ = uVar106;
  auVar79._0_8_ = uVar57;
  uVar106 = (undefined2)(uVar57 >> 0x10);
  auVar39._4_8_ = auVar79._8_8_;
  auVar39._2_2_ = uVar106;
  auVar39._0_2_ = uVar106;
  auVar196._0_4_ = ((float)(int)(short)uVar57 - fVar166) * fVar141;
  auVar196._4_4_ = ((float)(auVar39._0_4_ >> 0x10) - fVar174) * fVar108;
  auVar196._8_4_ = ((float)(auVar79._8_4_ >> 0x10) - fVar175) * fVar132;
  auVar196._12_4_ = ((float)(auVar80._12_4_ >> 0x10) - fVar228) * fVar142;
  uVar57 = *(ulong *)(prim + uVar58 * 0xe + 6);
  uVar106 = (undefined2)(uVar57 >> 0x30);
  auVar84._8_4_ = 0;
  auVar84._0_8_ = uVar57;
  auVar84._12_2_ = uVar106;
  auVar84._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar57 >> 0x20);
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._8_2_ = 0;
  auVar83._0_8_ = uVar57;
  auVar83._10_2_ = uVar106;
  auVar82._10_6_ = auVar83._10_6_;
  auVar82._8_2_ = uVar106;
  auVar82._0_8_ = uVar57;
  uVar106 = (undefined2)(uVar57 >> 0x10);
  auVar40._4_8_ = auVar82._8_8_;
  auVar40._2_2_ = uVar106;
  auVar40._0_2_ = uVar106;
  auVar110._0_8_ =
       CONCAT44(((float)(auVar40._0_4_ >> 0x10) - fVar252) * fVar109,
                ((float)(int)(short)uVar57 - fVar234) * fVar66);
  auVar110._8_4_ = ((float)(auVar82._8_4_ >> 0x10) - fVar257) * fVar133;
  auVar110._12_4_ = ((float)(auVar83._12_4_ >> 0x10) - fVar259) * fVar161;
  uVar57 = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  uVar106 = (undefined2)(uVar57 >> 0x30);
  auVar87._8_4_ = 0;
  auVar87._0_8_ = uVar57;
  auVar87._12_2_ = uVar106;
  auVar87._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar57 >> 0x20);
  auVar86._12_4_ = auVar87._12_4_;
  auVar86._8_2_ = 0;
  auVar86._0_8_ = uVar57;
  auVar86._10_2_ = uVar106;
  auVar85._10_6_ = auVar86._10_6_;
  auVar85._8_2_ = uVar106;
  auVar85._0_8_ = uVar57;
  uVar106 = (undefined2)(uVar57 >> 0x10);
  auVar41._4_8_ = auVar85._8_8_;
  auVar41._2_2_ = uVar106;
  auVar41._0_2_ = uVar106;
  auVar229._0_4_ = ((float)(int)(short)uVar57 - fVar234) * fVar66;
  auVar229._4_4_ = ((float)(auVar41._0_4_ >> 0x10) - fVar252) * fVar109;
  auVar229._8_4_ = ((float)(auVar85._8_4_ >> 0x10) - fVar257) * fVar133;
  auVar229._12_4_ = ((float)(auVar86._12_4_ >> 0x10) - fVar259) * fVar161;
  uVar57 = *(ulong *)(prim + uVar58 * 0x15 + 6);
  uVar106 = (undefined2)(uVar57 >> 0x30);
  auVar90._8_4_ = 0;
  auVar90._0_8_ = uVar57;
  auVar90._12_2_ = uVar106;
  auVar90._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar57 >> 0x20);
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._8_2_ = 0;
  auVar89._0_8_ = uVar57;
  auVar89._10_2_ = uVar106;
  auVar88._10_6_ = auVar89._10_6_;
  auVar88._8_2_ = uVar106;
  auVar88._0_8_ = uVar57;
  uVar106 = (undefined2)(uVar57 >> 0x10);
  auVar42._4_8_ = auVar88._8_8_;
  auVar42._2_2_ = uVar106;
  auVar42._0_2_ = uVar106;
  auVar91._0_8_ =
       CONCAT44(((float)(auVar42._0_4_ >> 0x10) - fVar223) * fVar131,
                ((float)(int)(short)uVar57 - fVar208) * fVar107);
  auVar91._8_4_ = ((float)(auVar88._8_4_ >> 0x10) - fVar225) * fVar140;
  auVar91._12_4_ = ((float)(auVar89._12_4_ >> 0x10) - fVar232) * fVar163;
  uVar57 = *(ulong *)(prim + uVar58 * 0x17 + 6);
  uVar106 = (undefined2)(uVar57 >> 0x30);
  auVar212._8_4_ = 0;
  auVar212._0_8_ = uVar57;
  auVar212._12_2_ = uVar106;
  auVar212._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar57 >> 0x20);
  auVar211._12_4_ = auVar212._12_4_;
  auVar211._8_2_ = 0;
  auVar211._0_8_ = uVar57;
  auVar211._10_2_ = uVar106;
  auVar210._10_6_ = auVar211._10_6_;
  auVar210._8_2_ = uVar106;
  auVar210._0_8_ = uVar57;
  uVar106 = (undefined2)(uVar57 >> 0x10);
  auVar43._4_8_ = auVar210._8_8_;
  auVar43._2_2_ = uVar106;
  auVar43._0_2_ = uVar106;
  auVar213._0_4_ = ((float)(int)(short)uVar57 - fVar208) * fVar107;
  auVar213._4_4_ = ((float)(auVar43._0_4_ >> 0x10) - fVar223) * fVar131;
  auVar213._8_4_ = ((float)(auVar210._8_4_ >> 0x10) - fVar225) * fVar140;
  auVar213._12_4_ = ((float)(auVar211._12_4_ >> 0x10) - fVar232) * fVar163;
  auVar239._8_4_ = auVar145._8_4_;
  auVar239._0_8_ = auVar145._0_8_;
  auVar239._12_4_ = auVar145._12_4_;
  auVar240 = minps(auVar239,auVar196);
  auVar135._8_4_ = auVar110._8_4_;
  auVar135._0_8_ = auVar110._0_8_;
  auVar135._12_4_ = auVar110._12_4_;
  auVar75 = minps(auVar135,auVar229);
  auVar240 = maxps(auVar240,auVar75);
  auVar136._8_4_ = auVar91._8_4_;
  auVar136._0_8_ = auVar91._0_8_;
  auVar136._12_4_ = auVar91._12_4_;
  auVar75 = minps(auVar136,auVar213);
  uVar47 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar168._4_4_ = uVar47;
  auVar168._0_4_ = uVar47;
  auVar168._8_4_ = uVar47;
  auVar168._12_4_ = uVar47;
  auVar75 = maxps(auVar75,auVar168);
  auVar75 = maxps(auVar240,auVar75);
  fVar66 = auVar75._0_4_ * 0.99999964;
  fVar107 = auVar75._4_4_ * 0.99999964;
  fVar108 = auVar75._8_4_ * 0.99999964;
  fVar109 = auVar75._12_4_ * 0.99999964;
  auVar240 = maxps(auVar145,auVar196);
  auVar75 = maxps(auVar110,auVar229);
  auVar240 = minps(auVar240,auVar75);
  auVar75 = maxps(auVar91,auVar213);
  fVar141 = ray->tfar;
  auVar111._4_4_ = fVar141;
  auVar111._0_4_ = fVar141;
  auVar111._8_4_ = fVar141;
  auVar111._12_4_ = fVar141;
  auVar75 = minps(auVar75,auVar111);
  auVar75 = minps(auVar240,auVar75);
  auVar112._0_4_ = -(uint)(PVar8 != (Primitive)0x0 && fVar66 <= auVar75._0_4_ * 1.0000004);
  auVar112._4_4_ = -(uint)(1 < (byte)PVar8 && fVar107 <= auVar75._4_4_ * 1.0000004);
  auVar112._8_4_ = -(uint)(2 < (byte)PVar8 && fVar108 <= auVar75._8_4_ * 1.0000004);
  auVar112._12_4_ = -(uint)(3 < (byte)PVar8 && fVar109 <= auVar75._12_4_ * 1.0000004);
  uVar61 = movmskps((int)(uVar58 * 0x15),auVar112);
  auVar113._0_12_ = mm_lookupmask_ps._240_12_;
  auVar113._12_4_ = 0;
  local_2f8 = prim;
LAB_00316911:
  local_2f0 = (ulong)uVar61;
  if (local_2f0 == 0) {
LAB_00318e6e:
    return local_2f0 != 0;
  }
  lVar49 = 0;
  if (local_2f0 != 0) {
    for (; (uVar61 >> lVar49 & 1) == 0; lVar49 = lVar49 + 1) {
    }
  }
  uVar58 = local_2f0 - 1 & local_2f0;
  pRVar52 = (RayQueryContext *)(ulong)*(uint *)(local_2f8 + 2);
  pGVar9 = (context->scene->geometries).items[(long)pRVar52].ptr;
  _Var10 = pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  uVar57 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           _Var10 * *(uint *)(local_2f8 + lVar49 * 4 + 6));
  pRVar54 = (RayQueryContext *)pGVar9[1].intersectionFilterN;
  lVar49 = *(long *)&pGVar9[1].time_range.upper;
  pfVar1 = (float *)(lVar49 + (long)pRVar54 * uVar57);
  pfVar2 = (float *)(lVar49 + (uVar57 + 1) * (long)pRVar54);
  pfVar3 = (float *)(lVar49 + (uVar57 + 2) * (long)pRVar54);
  lVar11 = 0;
  if (uVar58 != 0) {
    for (; (uVar58 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
    }
  }
  pfVar4 = (float *)(lVar49 + (uVar57 + 3) * (long)pRVar54);
  if ((uVar58 != 0) && (uVar57 = uVar58 - 1 & uVar58, uVar57 != 0)) {
    lVar49 = 0;
    if (uVar57 != 0) {
      for (; (uVar57 >> lVar49 & 1) == 0; lVar49 = lVar49 + 1) {
      }
    }
    pRVar54 = (RayQueryContext *)
              ((long)pRVar54 *
              (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                              _Var10 * *(uint *)(local_2f8 + lVar49 * 4 + 6)));
  }
  fVar141 = (ray->org).field_0.m128[0];
  fVar131 = (ray->org).field_0.m128[1];
  fVar132 = (ray->org).field_0.m128[2];
  local_2d8 = (ray->dir).field_0.m128[0];
  fVar133 = (ray->dir).field_0.m128[1];
  fVar140 = (ray->dir).field_0.m128[2];
  fVar142 = (ray->dir).field_0.m128[3];
  fVar163 = local_2d8 * local_2d8;
  fVar161 = fVar133 * fVar133;
  fVar175 = fVar140 * fVar140;
  fVar142 = fVar142 * fVar142;
  fVar166 = fVar163 + fVar161 + fVar175;
  auVar169._0_8_ = CONCAT44(fVar161 + fVar161 + fVar142,fVar166);
  auVar169._8_4_ = fVar175 + fVar161 + fVar175;
  auVar169._12_4_ = fVar142 + fVar161 + fVar142;
  auVar146._8_4_ = auVar169._8_4_;
  auVar146._0_8_ = auVar169._0_8_;
  auVar146._12_4_ = auVar169._12_4_;
  auVar75 = rcpss(auVar146,auVar169);
  fVar208 = (2.0 - fVar166 * auVar75._0_4_) * auVar75._0_4_ *
            (((pfVar1[2] + pfVar2[2] + pfVar3[2] + pfVar4[2]) * 0.25 - fVar132) * fVar140 +
            ((pfVar1[1] + pfVar2[1] + pfVar3[1] + pfVar4[1]) * 0.25 - fVar131) * fVar133 +
            ((*pfVar1 + *pfVar2 + *pfVar3 + *pfVar4) * 0.25 - fVar141) * local_2d8);
  local_308 = ZEXT416((uint)fVar208);
  fVar141 = local_2d8 * fVar208 + fVar141;
  fVar131 = fVar133 * fVar208 + fVar131;
  fVar132 = fVar140 * fVar208 + fVar132;
  fVar223 = *pfVar1 - fVar141;
  fVar225 = pfVar1[1] - fVar131;
  fVar232 = pfVar1[2] - fVar132;
  fVar178 = pfVar1[3] - 0.0;
  fVar250 = *pfVar3 - fVar141;
  fVar251 = pfVar3[1] - fVar131;
  fVar252 = pfVar3[2] - fVar132;
  fVar257 = pfVar3[3] - 0.0;
  fVar203 = *pfVar2 - fVar141;
  fVar205 = pfVar2[1] - fVar131;
  fVar234 = pfVar2[2] - fVar132;
  fVar237 = pfVar2[3] - 0.0;
  fVar141 = *pfVar4 - fVar141;
  fVar131 = pfVar4[1] - fVar131;
  fVar132 = pfVar4[2] - fVar132;
  fVar259 = pfVar4[3] - 0.0;
  fVar166 = fVar163 + fVar175 + fVar161;
  fVar174 = fVar163 + fVar175 + fVar161;
  fVar228 = fVar163 + fVar175 + fVar161;
  fVar163 = fVar163 + fVar175 + fVar161;
  local_2c8 = fVar257;
  fStack_2c4 = fVar257;
  fStack_2c0 = fVar257;
  fStack_2bc = fVar257;
  fStack_2d4 = local_2d8;
  fStack_2d0 = local_2d8;
  fStack_2cc = local_2d8;
  local_2e8 = ABS(fVar166);
  fStack_2e4 = ABS(fVar174);
  fStack_2e0 = ABS(fVar228);
  fStack_2dc = ABS(fVar163);
  bVar55 = 0;
  pSVar48 = (StackEntry *)0x1;
  local_61c = 1;
  fVar142 = 0.0;
  fVar161 = 1.0;
  pRVar53 = (RayQueryContext *)0x0;
  do {
    fVar134 = fVar161 - fVar142;
    fVar262 = fVar134 * 0.0 + fVar142;
    fVar265 = fVar134 * 0.33333334 + fVar142;
    fVar267 = fVar134 * 0.6666667 + fVar142;
    fVar275 = fVar134 * 1.0 + fVar142;
    fVar282 = 1.0 - fVar262;
    fVar285 = 1.0 - fVar265;
    fVar288 = 1.0 - fVar267;
    fVar290 = 1.0 - fVar275;
    fVar276 = fVar203 * fVar282 + fVar250 * fVar262;
    fVar283 = fVar203 * fVar285 + fVar250 * fVar265;
    fVar286 = fVar203 * fVar288 + fVar250 * fVar267;
    fVar289 = fVar203 * fVar290 + fVar250 * fVar275;
    fVar263 = fVar205 * fVar282 + fVar251 * fVar262;
    fVar266 = fVar205 * fVar285 + fVar251 * fVar265;
    fVar268 = fVar205 * fVar288 + fVar251 * fVar267;
    fVar271 = fVar205 * fVar290 + fVar251 * fVar275;
    fVar253 = fVar234 * fVar282 + fVar252 * fVar262;
    fVar258 = fVar234 * fVar285 + fVar252 * fVar265;
    fVar260 = fVar234 * fVar288 + fVar252 * fVar267;
    fVar261 = fVar234 * fVar290 + fVar252 * fVar275;
    fVar175 = fVar237 * fVar282 + local_2c8 * fVar262;
    fVar233 = fVar237 * fVar285 + fStack_2c4 * fVar265;
    fVar235 = fVar237 * fVar288 + fStack_2c0 * fVar267;
    fVar236 = fVar237 * fVar290 + fStack_2bc * fVar275;
    fVar298 = (fVar223 * fVar282 + fVar203 * fVar262) * fVar282 + fVar262 * fVar276;
    fVar302 = (fVar223 * fVar285 + fVar203 * fVar265) * fVar285 + fVar265 * fVar283;
    fVar306 = (fVar223 * fVar288 + fVar203 * fVar267) * fVar288 + fVar267 * fVar286;
    fVar310 = (fVar223 * fVar290 + fVar203 * fVar275) * fVar290 + fVar275 * fVar289;
    fVar314 = (fVar225 * fVar282 + fVar205 * fVar262) * fVar282 + fVar262 * fVar263;
    fVar316 = (fVar225 * fVar285 + fVar205 * fVar265) * fVar285 + fVar265 * fVar266;
    fVar176 = (fVar225 * fVar288 + fVar205 * fVar267) * fVar288 + fVar267 * fVar268;
    fVar177 = (fVar225 * fVar290 + fVar205 * fVar275) * fVar290 + fVar275 * fVar271;
    fVar179 = (fVar232 * fVar282 + fVar234 * fVar262) * fVar282 + fVar262 * fVar253;
    fVar204 = (fVar232 * fVar285 + fVar234 * fVar265) * fVar285 + fVar265 * fVar258;
    fVar206 = (fVar232 * fVar288 + fVar234 * fVar267) * fVar288 + fVar267 * fVar260;
    fVar207 = (fVar232 * fVar290 + fVar234 * fVar275) * fVar290 + fVar275 * fVar261;
    fVar209 = (fVar178 * fVar282 + fVar237 * fVar262) * fVar282 + fVar262 * fVar175;
    fVar224 = (fVar178 * fVar285 + fVar237 * fVar265) * fVar285 + fVar265 * fVar233;
    fVar226 = (fVar178 * fVar288 + fVar237 * fVar267) * fVar288 + fVar267 * fVar235;
    fVar227 = (fVar178 * fVar290 + fVar237 * fVar275) * fVar290 + fVar275 * fVar236;
    fVar277 = fVar276 * fVar282 + (fVar250 * fVar282 + fVar141 * fVar262) * fVar262;
    fVar284 = fVar283 * fVar285 + (fVar250 * fVar285 + fVar141 * fVar265) * fVar265;
    fVar287 = fVar286 * fVar288 + (fVar250 * fVar288 + fVar141 * fVar267) * fVar267;
    fVar289 = fVar289 * fVar290 + (fVar250 * fVar290 + fVar141 * fVar275) * fVar275;
    fVar276 = fVar263 * fVar282 + (fVar251 * fVar282 + fVar131 * fVar262) * fVar262;
    fVar283 = fVar266 * fVar285 + (fVar251 * fVar285 + fVar131 * fVar265) * fVar265;
    fVar286 = fVar268 * fVar288 + (fVar251 * fVar288 + fVar131 * fVar267) * fVar267;
    fVar271 = fVar271 * fVar290 + (fVar251 * fVar290 + fVar131 * fVar275) * fVar275;
    fVar263 = fVar253 * fVar282 + (fVar252 * fVar282 + fVar132 * fVar262) * fVar262;
    fVar258 = fVar258 * fVar285 + (fVar252 * fVar285 + fVar132 * fVar265) * fVar265;
    fVar260 = fVar260 * fVar288 + (fVar252 * fVar288 + fVar132 * fVar267) * fVar267;
    fVar266 = fVar261 * fVar290 + (fVar252 * fVar290 + fVar132 * fVar275) * fVar275;
    fVar253 = fVar175 * fVar282 + (local_2c8 * fVar282 + fVar259 * fVar262) * fVar262;
    fVar233 = fVar233 * fVar285 + (fStack_2c4 * fVar285 + fVar259 * fVar265) * fVar265;
    fVar235 = fVar235 * fVar288 + (fStack_2c0 * fVar288 + fVar259 * fVar267) * fVar267;
    fVar236 = fVar236 * fVar290 + (fStack_2bc * fVar290 + fVar259 * fVar275) * fVar275;
    fVar311 = fVar282 * fVar298 + fVar262 * fVar277;
    fVar315 = fVar285 * fVar302 + fVar265 * fVar284;
    fVar317 = fVar288 * fVar306 + fVar267 * fVar287;
    fVar318 = fVar290 * fVar310 + fVar275 * fVar289;
    fVar319 = fVar282 * fVar314 + fVar262 * fVar276;
    fVar330 = fVar285 * fVar316 + fVar265 * fVar283;
    fVar331 = fVar288 * fVar176 + fVar267 * fVar286;
    fVar332 = fVar290 * fVar177 + fVar275 * fVar271;
    fVar291 = fVar282 * fVar179 + fVar262 * fVar263;
    fVar299 = fVar285 * fVar204 + fVar265 * fVar258;
    fVar303 = fVar288 * fVar206 + fVar267 * fVar260;
    fVar307 = fVar290 * fVar207 + fVar275 * fVar266;
    fVar175 = fVar134 * 0.11111111;
    fVar282 = fVar282 * fVar209 + fVar262 * fVar253;
    fVar285 = fVar285 * fVar224 + fVar265 * fVar233;
    auVar137._0_8_ = CONCAT44(fVar285,fVar282);
    auVar137._8_4_ = fVar288 * fVar226 + fVar267 * fVar235;
    auVar137._12_4_ = fVar290 * fVar227 + fVar275 * fVar236;
    auVar279._0_4_ = (fVar277 - fVar298) * 3.0 * fVar175;
    auVar279._4_4_ = (fVar284 - fVar302) * 3.0 * fVar175;
    auVar279._8_4_ = (fVar287 - fVar306) * 3.0 * fVar175;
    auVar279._12_4_ = (fVar289 - fVar310) * 3.0 * fVar175;
    fVar268 = (fVar276 - fVar314) * 3.0 * fVar175;
    fVar277 = (fVar283 - fVar316) * 3.0 * fVar175;
    fVar289 = (fVar286 - fVar176) * 3.0 * fVar175;
    fVar272 = (fVar271 - fVar177) * 3.0 * fVar175;
    fVar263 = (fVar263 - fVar179) * 3.0 * fVar175;
    fVar258 = (fVar258 - fVar204) * 3.0 * fVar175;
    fVar261 = (fVar260 - fVar206) * 3.0 * fVar175;
    fVar276 = (fVar266 - fVar207) * 3.0 * fVar175;
    fVar262 = fVar175 * (fVar233 - fVar224) * 3.0;
    fVar265 = fVar175 * (fVar235 - fVar226) * 3.0;
    fVar267 = fVar175 * (fVar236 - fVar227) * 3.0;
    auVar170._4_4_ = auVar137._8_4_;
    auVar170._0_4_ = fVar285;
    local_608._4_4_ = fVar285 + fVar262;
    local_608._0_4_ = fVar282 + fVar175 * (fVar253 - fVar209) * 3.0;
    fStack_600 = auVar137._8_4_ + fVar265;
    fStack_5fc = auVar137._12_4_ + fVar267;
    auVar170._8_4_ = auVar137._12_4_;
    auVar170._12_4_ = 0;
    auVar114._0_8_ = CONCAT44(auVar137._8_4_ - fVar265,fVar285 - fVar262);
    auVar114._8_4_ = auVar137._12_4_ - fVar267;
    auVar114._12_4_ = 0;
    fVar177 = fVar330 - fVar319;
    fVar179 = fVar331 - fVar330;
    fVar204 = fVar332 - fVar331;
    fVar206 = 0.0 - fVar332;
    fVar227 = fVar299 - fVar291;
    fVar253 = fVar303 - fVar299;
    fVar233 = fVar307 - fVar303;
    fVar235 = 0.0 - fVar307;
    fVar275 = fVar268 * fVar227 - fVar263 * fVar177;
    fVar282 = fVar277 * fVar253 - fVar258 * fVar179;
    fVar285 = fVar289 * fVar233 - fVar261 * fVar204;
    fVar288 = fVar272 * fVar235 - fVar276 * fVar206;
    local_318._0_4_ = fVar315 - fVar311;
    local_318._4_4_ = fVar317 - fVar315;
    fStack_310 = fVar318 - fVar317;
    fStack_30c = 0.0 - fVar318;
    fVar290 = fVar263 * (float)local_318._0_4_ - auVar279._0_4_ * fVar227;
    fVar298 = fVar258 * (float)local_318._4_4_ - auVar279._4_4_ * fVar253;
    fVar302 = fVar261 * fStack_310 - auVar279._8_4_ * fVar233;
    fVar306 = fVar276 * fStack_30c - auVar279._12_4_ * fVar235;
    fVar310 = auVar279._0_4_ * fVar177 - fVar268 * (float)local_318._0_4_;
    fVar314 = auVar279._4_4_ * fVar179 - fVar277 * (float)local_318._4_4_;
    fVar316 = auVar279._8_4_ * fVar204 - fVar289 * fStack_310;
    fVar176 = auVar279._12_4_ * fVar206 - fVar272 * fStack_30c;
    auVar92._0_4_ = fVar227 * fVar227;
    auVar92._4_4_ = fVar253 * fVar253;
    auVar92._8_4_ = fVar233 * fVar233;
    auVar92._12_4_ = fVar235 * fVar235;
    auVar230._0_4_ =
         (float)local_318._0_4_ * (float)local_318._0_4_ + fVar177 * fVar177 + auVar92._0_4_;
    auVar230._4_4_ =
         (float)local_318._4_4_ * (float)local_318._4_4_ + fVar179 * fVar179 + auVar92._4_4_;
    auVar230._8_4_ = fStack_310 * fStack_310 + fVar204 * fVar204 + auVar92._8_4_;
    auVar230._12_4_ = fStack_30c * fStack_30c + fVar206 * fVar206 + auVar92._12_4_;
    auVar75 = rcpps(auVar92,auVar230);
    fVar175 = auVar75._0_4_;
    fVar262 = auVar75._4_4_;
    fVar265 = auVar75._8_4_;
    fVar267 = auVar75._12_4_;
    fVar175 = (1.0 - fVar175 * auVar230._0_4_) * fVar175 + fVar175;
    fVar262 = (1.0 - fVar262 * auVar230._4_4_) * fVar262 + fVar262;
    fVar265 = (1.0 - fVar265 * auVar230._8_4_) * fVar265 + fVar265;
    fVar267 = (1.0 - fVar267 * auVar230._12_4_) * fVar267 + fVar267;
    fVar207 = fVar227 * fVar277 - fVar177 * fVar258;
    fVar209 = fVar253 * fVar289 - fVar179 * fVar261;
    fVar224 = fVar233 * fVar272 - fVar204 * fVar276;
    fVar226 = fVar235 * 0.0 - fVar206 * 0.0;
    fVar236 = (float)local_318._0_4_ * fVar258 - fVar227 * auVar279._4_4_;
    fVar260 = (float)local_318._4_4_ * fVar261 - fVar253 * auVar279._8_4_;
    fVar266 = fStack_310 * fVar276 - fVar233 * auVar279._12_4_;
    fVar283 = fStack_30c * 0.0 - fVar235 * 0.0;
    fVar286 = fVar177 * auVar279._4_4_ - (float)local_318._0_4_ * fVar277;
    fVar271 = fVar179 * auVar279._8_4_ - (float)local_318._4_4_ * fVar289;
    fVar284 = fVar204 * auVar279._12_4_ - fStack_310 * fVar272;
    fVar287 = fVar206 * 0.0 - fStack_30c * 0.0;
    auVar197._0_4_ = (fVar275 * fVar275 + fVar290 * fVar290 + fVar310 * fVar310) * fVar175;
    auVar197._4_4_ = (fVar282 * fVar282 + fVar298 * fVar298 + fVar314 * fVar314) * fVar262;
    auVar197._8_4_ = (fVar285 * fVar285 + fVar302 * fVar302 + fVar316 * fVar316) * fVar265;
    auVar197._12_4_ = (fVar288 * fVar288 + fVar306 * fVar306 + fVar176 * fVar176) * fVar267;
    auVar241._0_4_ = (fVar207 * fVar207 + fVar236 * fVar236 + fVar286 * fVar286) * fVar175;
    auVar241._4_4_ = (fVar209 * fVar209 + fVar260 * fVar260 + fVar271 * fVar271) * fVar262;
    auVar241._8_4_ = (fVar224 * fVar224 + fVar266 * fVar266 + fVar284 * fVar284) * fVar265;
    auVar241._12_4_ = (fVar226 * fVar226 + fVar283 * fVar283 + fVar287 * fVar287) * fVar267;
    auVar198 = maxps(auVar197,auVar241);
    auVar214._8_4_ = auVar137._8_4_;
    auVar214._0_8_ = auVar137._0_8_;
    auVar214._12_4_ = auVar137._12_4_;
    auVar75 = maxps(auVar214,_local_608);
    auVar242._8_4_ = auVar114._8_4_;
    auVar242._0_8_ = auVar114._0_8_;
    auVar242._12_4_ = 0;
    auVar240 = maxps(auVar242,auVar170);
    auVar215 = maxps(auVar75,auVar240);
    auVar240 = minps(auVar137,_local_608);
    auVar75 = minps(auVar114,auVar170);
    auVar240 = minps(auVar240,auVar75);
    auVar75 = sqrtps(auVar75,auVar198);
    auVar198 = rsqrtps(auVar279 >> 0x20,auVar230);
    fVar175 = auVar198._0_4_;
    fVar262 = auVar198._4_4_;
    fVar267 = auVar198._8_4_;
    fVar275 = auVar198._12_4_;
    fVar265 = fVar175 * fVar175 * auVar230._0_4_ * -0.5 * fVar175 + fVar175 * 1.5;
    fVar282 = fVar262 * fVar262 * auVar230._4_4_ * -0.5 * fVar262 + fVar262 * 1.5;
    fVar290 = fVar267 * fVar267 * auVar230._8_4_ * -0.5 * fVar267 + fVar267 * 1.5;
    fVar306 = fVar275 * fVar275 * auVar230._12_4_ * -0.5 * fVar275 + fVar275 * 1.5;
    fVar175 = 0.0 - fVar319;
    fVar267 = 0.0 - fVar330;
    fVar285 = 0.0 - fVar331;
    fVar298 = 0.0 - fVar332;
    fVar286 = 0.0 - fVar291;
    fVar284 = 0.0 - fVar299;
    fVar269 = 0.0 - fVar303;
    fVar273 = 0.0 - fVar307;
    fVar236 = 0.0 - fVar311;
    fVar260 = 0.0 - fVar315;
    fVar266 = 0.0 - fVar317;
    fVar283 = 0.0 - fVar318;
    fVar207 = local_2d8 * (float)local_318._0_4_ * fVar265 +
              fVar133 * fVar177 * fVar265 + fVar140 * fVar227 * fVar265;
    fVar209 = fStack_2d4 * (float)local_318._4_4_ * fVar282 +
              fVar133 * fVar179 * fVar282 + fVar140 * fVar253 * fVar282;
    fVar224 = fStack_2d0 * fStack_310 * fVar290 +
              fVar133 * fVar204 * fVar290 + fVar140 * fVar233 * fVar290;
    fVar226 = fStack_2cc * fStack_30c * fVar306 +
              fVar133 * fVar206 * fVar306 + fVar140 * fVar235 * fVar306;
    local_328._0_4_ =
         (float)local_318._0_4_ * fVar265 * fVar236 +
         fVar177 * fVar265 * fVar175 + fVar227 * fVar265 * fVar286;
    local_328._4_4_ =
         (float)local_318._4_4_ * fVar282 * fVar260 +
         fVar179 * fVar282 * fVar267 + fVar253 * fVar282 * fVar284;
    fStack_320 = fStack_310 * fVar290 * fVar266 +
                 fVar204 * fVar290 * fVar285 + fVar233 * fVar290 * fVar269;
    fStack_31c = fStack_30c * fVar306 * fVar283 +
                 fVar206 * fVar306 * fVar298 + fVar235 * fVar306 * fVar273;
    fVar292 = (local_2d8 * fVar236 + fVar133 * fVar175 + fVar140 * fVar286) -
              fVar207 * (float)local_328._0_4_;
    fVar300 = (fStack_2d4 * fVar260 + fVar133 * fVar267 + fVar140 * fVar284) -
              fVar209 * (float)local_328._4_4_;
    fVar304 = (fStack_2d0 * fVar266 + fVar133 * fVar285 + fVar140 * fVar269) - fVar224 * fStack_320;
    fVar308 = (fStack_2cc * fVar283 + fVar133 * fVar298 + fVar140 * fVar273) - fVar226 * fStack_31c;
    fVar262 = (fVar236 * fVar236 + fVar175 * fVar175 + fVar286 * fVar286) -
              (float)local_328._0_4_ * (float)local_328._0_4_;
    fVar275 = (fVar260 * fVar260 + fVar267 * fVar267 + fVar284 * fVar284) -
              (float)local_328._4_4_ * (float)local_328._4_4_;
    fVar288 = (fVar266 * fVar266 + fVar285 * fVar285 + fVar269 * fVar269) - fStack_320 * fStack_320;
    fVar302 = (fVar283 * fVar283 + fVar298 * fVar298 + fVar273 * fVar273) - fStack_31c * fStack_31c;
    fVar310 = (auVar215._0_4_ + auVar75._0_4_) * 1.0000002;
    fVar314 = (auVar215._4_4_ + auVar75._4_4_) * 1.0000002;
    fVar316 = (auVar215._8_4_ + auVar75._8_4_) * 1.0000002;
    fVar176 = (auVar215._12_4_ + auVar75._12_4_) * 1.0000002;
    fVar310 = fVar262 - fVar310 * fVar310;
    fVar314 = fVar275 - fVar314 * fVar314;
    fVar316 = fVar288 - fVar316 * fVar316;
    fVar176 = fVar302 - fVar176 * fVar176;
    auVar320._0_4_ = fVar166 - fVar207 * fVar207;
    auVar320._4_4_ = fVar174 - fVar209 * fVar209;
    auVar320._8_4_ = fVar228 - fVar224 * fVar224;
    auVar320._12_4_ = fVar163 - fVar226 * fVar226;
    fVar292 = fVar292 + fVar292;
    fVar300 = fVar300 + fVar300;
    fVar304 = fVar304 + fVar304;
    fVar308 = fVar308 + fVar308;
    auVar115._0_4_ = fVar292 * fVar292 - auVar320._0_4_ * 4.0 * fVar310;
    auVar115._4_4_ = fVar300 * fVar300 - auVar320._4_4_ * 4.0 * fVar314;
    auVar115._8_4_ = fVar304 * fVar304 - auVar320._8_4_ * 4.0 * fVar316;
    auVar115._12_4_ = fVar308 * fVar308 - auVar320._12_4_ * 4.0 * fVar176;
    local_5d8._4_4_ = (auVar240._4_4_ - auVar75._4_4_) * 0.99999976;
    local_5d8._0_4_ = (auVar240._0_4_ - auVar75._0_4_) * 0.99999976;
    fStack_5d0 = (auVar240._8_4_ - auVar75._8_4_) * 0.99999976;
    fStack_5cc = (auVar240._12_4_ - auVar75._12_4_) * 0.99999976;
    auVar243._0_12_ = ZEXT812(0);
    auVar243._12_4_ = 0;
    auVar199._4_4_ = -(uint)(0.0 <= auVar115._4_4_);
    auVar199._0_4_ = -(uint)(0.0 <= auVar115._0_4_);
    auVar199._8_4_ = -(uint)(0.0 <= auVar115._8_4_);
    auVar199._12_4_ = -(uint)(0.0 <= auVar115._12_4_);
    uVar47 = (undefined4)((ulong)pSVar48 >> 0x20);
    iVar45 = movmskps((int)pSVar48,auVar199);
    local_338 = -fVar292;
    fStack_334 = -fVar300;
    fStack_330 = -fVar304;
    fStack_32c = -fVar308;
    auVar333._0_8_ = CONCAT44(fVar209 * fVar209,fVar207 * fVar207) & 0x7fffffff7fffffff;
    auVar333._8_4_ = ABS(fVar224 * fVar224);
    auVar333._12_4_ = ABS(fVar226 * fVar226);
    fVar271 = ABS(auVar320._0_4_);
    fVar287 = ABS(auVar320._4_4_);
    fVar270 = ABS(auVar320._8_4_);
    fVar274 = ABS(auVar320._12_4_);
    if (iVar45 == 0) {
      iVar45 = 0;
      auVar244 = _DAT_01f45a40;
      auVar312 = _DAT_01f45a30;
    }
    else {
      auVar240 = sqrtps(auVar320,auVar115);
      bVar60 = 0.0 <= auVar115._0_4_;
      uVar61 = -(uint)bVar60;
      bVar12 = 0.0 <= auVar115._4_4_;
      uVar62 = -(uint)bVar12;
      bVar13 = 0.0 <= auVar115._8_4_;
      uVar63 = -(uint)bVar13;
      bVar14 = 0.0 <= auVar115._12_4_;
      uVar64 = -(uint)bVar14;
      auVar216._0_4_ = auVar320._0_4_ + auVar320._0_4_;
      auVar216._4_4_ = auVar320._4_4_ + auVar320._4_4_;
      auVar216._8_4_ = auVar320._8_4_ + auVar320._8_4_;
      auVar216._12_4_ = auVar320._12_4_ + auVar320._12_4_;
      auVar75 = rcpps(auVar243,auVar216);
      fVar293 = auVar75._0_4_;
      fVar301 = auVar75._4_4_;
      fVar305 = auVar75._8_4_;
      fVar309 = auVar75._12_4_;
      fVar293 = (1.0 - auVar216._0_4_ * fVar293) * fVar293 + fVar293;
      fVar301 = (1.0 - auVar216._4_4_ * fVar301) * fVar301 + fVar301;
      fVar305 = (1.0 - auVar216._8_4_ * fVar305) * fVar305 + fVar305;
      fVar309 = (1.0 - auVar216._12_4_ * fVar309) * fVar309 + fVar309;
      fVar143 = (local_338 - auVar240._0_4_) * fVar293;
      fVar162 = (fStack_334 - auVar240._4_4_) * fVar301;
      fVar164 = (fStack_330 - auVar240._8_4_) * fVar305;
      fVar165 = (fStack_32c - auVar240._12_4_) * fVar309;
      fVar293 = (auVar240._0_4_ - fVar292) * fVar293;
      fVar301 = (auVar240._4_4_ - fVar300) * fVar301;
      fVar305 = (auVar240._8_4_ - fVar304) * fVar305;
      fVar309 = (auVar240._12_4_ - fVar308) * fVar309;
      local_228 = (fVar207 * fVar143 + (float)local_328._0_4_) * fVar265;
      fStack_224 = (fVar209 * fVar162 + (float)local_328._4_4_) * fVar282;
      fStack_220 = (fVar224 * fVar164 + fStack_320) * fVar290;
      fStack_21c = (fVar226 * fVar165 + fStack_31c) * fVar306;
      local_218 = (fVar207 * fVar293 + (float)local_328._0_4_) * fVar265;
      fStack_214 = (fVar209 * fVar301 + (float)local_328._4_4_) * fVar282;
      fStack_210 = (fVar224 * fVar305 + fStack_320) * fVar290;
      fStack_20c = (fVar226 * fVar309 + fStack_31c) * fVar306;
      auVar147._0_4_ = (uint)fVar143 & uVar61;
      auVar147._4_4_ = (uint)fVar162 & uVar62;
      auVar147._8_4_ = (uint)fVar164 & uVar63;
      auVar147._12_4_ = (uint)fVar165 & uVar64;
      auVar312._0_8_ = CONCAT44(~uVar62,~uVar61) & 0x7f8000007f800000;
      auVar312._8_4_ = ~uVar63 & 0x7f800000;
      auVar312._12_4_ = ~uVar64 & 0x7f800000;
      auVar312 = auVar312 | auVar147;
      auVar321._0_4_ = (uint)fVar293 & uVar61;
      auVar321._4_4_ = (uint)fVar301 & uVar62;
      auVar321._8_4_ = (uint)fVar305 & uVar63;
      auVar321._12_4_ = (uint)fVar309 & uVar64;
      auVar244._0_8_ = CONCAT44(~uVar62,~uVar61) & 0xff800000ff800000;
      auVar244._8_4_ = ~uVar63 & 0xff800000;
      auVar244._12_4_ = ~uVar64 & 0xff800000;
      auVar244 = auVar244 | auVar321;
      auVar24._4_4_ = fStack_2e4;
      auVar24._0_4_ = local_2e8;
      auVar24._8_4_ = fStack_2e0;
      auVar24._12_4_ = fStack_2dc;
      auVar75 = maxps(auVar24,auVar333);
      fVar143 = auVar75._0_4_ * 1.9073486e-06;
      fVar162 = auVar75._4_4_ * 1.9073486e-06;
      fVar164 = auVar75._8_4_ * 1.9073486e-06;
      fVar165 = auVar75._12_4_ * 1.9073486e-06;
      auVar322._0_4_ = -(uint)(fVar271 < fVar143 && bVar60);
      auVar322._4_4_ = -(uint)(fVar287 < fVar162 && bVar12);
      auVar322._8_4_ = -(uint)(fVar270 < fVar164 && bVar13);
      auVar322._12_4_ = -(uint)(fVar274 < fVar165 && bVar14);
      iVar45 = movmskps(iVar45,auVar322);
      if (iVar45 != 0) {
        uVar61 = -(uint)(fVar310 <= 0.0);
        uVar62 = -(uint)(fVar314 <= 0.0);
        uVar63 = -(uint)(fVar316 <= 0.0);
        uVar64 = -(uint)(fVar176 <= 0.0);
        auVar200._0_4_ = (uVar61 & 0xff800000 | ~uVar61 & 0x7f800000) & auVar322._0_4_;
        auVar200._4_4_ = (uVar62 & 0xff800000 | ~uVar62 & 0x7f800000) & auVar322._4_4_;
        auVar200._8_4_ = (uVar63 & 0xff800000 | ~uVar63 & 0x7f800000) & auVar322._8_4_;
        auVar200._12_4_ = (uVar64 & 0xff800000 | ~uVar64 & 0x7f800000) & auVar322._12_4_;
        auVar295._0_4_ = ~auVar322._0_4_ & auVar312._0_4_;
        auVar295._4_4_ = ~auVar322._4_4_ & auVar312._4_4_;
        auVar295._8_4_ = ~auVar322._8_4_ & auVar312._8_4_;
        auVar295._12_4_ = ~auVar322._12_4_ & auVar312._12_4_;
        auVar313._0_4_ = (uVar61 & 0x7f800000 | ~uVar61 & 0xff800000) & auVar322._0_4_;
        auVar313._4_4_ = (uVar62 & 0x7f800000 | ~uVar62 & 0xff800000) & auVar322._4_4_;
        auVar313._8_4_ = (uVar63 & 0x7f800000 | ~uVar63 & 0xff800000) & auVar322._8_4_;
        auVar313._12_4_ = (uVar64 & 0x7f800000 | ~uVar64 & 0xff800000) & auVar322._12_4_;
        auVar323._0_4_ = ~auVar322._0_4_ & auVar244._0_4_;
        auVar323._4_4_ = ~auVar322._4_4_ & auVar244._4_4_;
        auVar323._8_4_ = ~auVar322._8_4_ & auVar244._8_4_;
        auVar323._12_4_ = ~auVar322._12_4_ & auVar244._12_4_;
        auVar199._4_4_ = -(uint)((fVar162 <= fVar287 || fVar314 <= 0.0) && bVar12);
        auVar199._0_4_ = -(uint)((fVar143 <= fVar271 || fVar310 <= 0.0) && bVar60);
        auVar199._8_4_ = -(uint)((fVar164 <= fVar270 || fVar316 <= 0.0) && bVar13);
        auVar199._12_4_ = -(uint)((fVar165 <= fVar274 || fVar176 <= 0.0) && bVar14);
        auVar244 = auVar323 | auVar313;
        auVar312 = auVar295 | auVar200;
      }
    }
    auVar201._0_4_ = (auVar199._0_4_ << 0x1f) >> 0x1f;
    auVar201._4_4_ = (auVar199._4_4_ << 0x1f) >> 0x1f;
    auVar201._8_4_ = (auVar199._8_4_ << 0x1f) >> 0x1f;
    auVar201._12_4_ = (auVar199._12_4_ << 0x1f) >> 0x1f;
    auVar201 = auVar201 & auVar113;
    iVar45 = movmskps(iVar45,auVar201);
    uVar57 = CONCAT44(uVar47,iVar45);
    if (iVar45 != 0) {
      auVar334._0_4_ = (ray->org).field_0.m128[3] - (float)local_308._0_4_;
      auVar334._4_4_ = auVar334._0_4_;
      auVar334._8_4_ = auVar334._0_4_;
      auVar334._12_4_ = auVar334._0_4_;
      auVar198 = maxps(auVar334,auVar312);
      auVar296._0_4_ = ray->tfar - (float)local_308._0_4_;
      auVar296._4_4_ = auVar296._0_4_;
      auVar296._8_4_ = auVar296._0_4_;
      auVar296._12_4_ = auVar296._0_4_;
      auVar240 = minps(auVar296,auVar244);
      auVar116._0_4_ = fVar268 * fVar133 + fVar263 * fVar140;
      auVar116._4_4_ = fVar277 * fVar133 + fVar258 * fVar140;
      auVar116._8_4_ = fVar289 * fVar133 + fVar261 * fVar140;
      auVar116._12_4_ = fVar272 * fVar133 + fVar276 * fVar140;
      auVar254._0_4_ = auVar279._0_4_ * local_2d8 + auVar116._0_4_;
      auVar254._4_4_ = auVar279._4_4_ * fStack_2d4 + auVar116._4_4_;
      auVar254._8_4_ = auVar279._8_4_ * fStack_2d0 + auVar116._8_4_;
      auVar254._12_4_ = auVar279._12_4_ * fStack_2cc + auVar116._12_4_;
      auVar75 = rcpps(auVar116,auVar254);
      fVar310 = auVar75._0_4_;
      fVar314 = auVar75._4_4_;
      fVar316 = auVar75._8_4_;
      fVar176 = auVar75._12_4_;
      fVar175 = ((1.0 - auVar254._0_4_ * fVar310) * fVar310 + fVar310) *
                -(fVar236 * auVar279._0_4_ + fVar175 * fVar268 + fVar286 * fVar263);
      fVar267 = ((1.0 - auVar254._4_4_ * fVar314) * fVar314 + fVar314) *
                -(fVar260 * auVar279._4_4_ + fVar267 * fVar277 + fVar284 * fVar258);
      fVar285 = ((1.0 - auVar254._8_4_ * fVar316) * fVar316 + fVar316) *
                -(fVar266 * auVar279._8_4_ + fVar285 * fVar289 + fVar269 * fVar261);
      fVar298 = ((1.0 - auVar254._12_4_ * fVar176) * fVar176 + fVar176) *
                -(fVar283 * auVar279._12_4_ + fVar298 * fVar272 + fVar273 * fVar276);
      uVar61 = -(uint)(auVar254._0_4_ < 0.0 || ABS(auVar254._0_4_) < 1e-18);
      uVar62 = -(uint)(auVar254._4_4_ < 0.0 || ABS(auVar254._4_4_) < 1e-18);
      uVar63 = -(uint)(auVar254._8_4_ < 0.0 || ABS(auVar254._8_4_) < 1e-18);
      uVar64 = -(uint)(auVar254._12_4_ < 0.0 || ABS(auVar254._12_4_) < 1e-18);
      auVar148._0_8_ = CONCAT44(uVar62,uVar61) & 0xff800000ff800000;
      auVar148._8_4_ = uVar63 & 0xff800000;
      auVar148._12_4_ = uVar64 & 0xff800000;
      auVar117._0_4_ = ~uVar61 & (uint)fVar175;
      auVar117._4_4_ = ~uVar62 & (uint)fVar267;
      auVar117._8_4_ = ~uVar63 & (uint)fVar285;
      auVar117._12_4_ = ~uVar64 & (uint)fVar298;
      auVar198 = maxps(auVar198,auVar117 | auVar148);
      uVar61 = -(uint)(0.0 < auVar254._0_4_ || ABS(auVar254._0_4_) < 1e-18);
      uVar62 = -(uint)(0.0 < auVar254._4_4_ || ABS(auVar254._4_4_) < 1e-18);
      uVar63 = -(uint)(0.0 < auVar254._8_4_ || ABS(auVar254._8_4_) < 1e-18);
      uVar64 = -(uint)(0.0 < auVar254._12_4_ || ABS(auVar254._12_4_) < 1e-18);
      auVar118._0_8_ = CONCAT44(uVar62,uVar61) & 0x7f8000007f800000;
      auVar118._8_4_ = uVar63 & 0x7f800000;
      auVar118._12_4_ = uVar64 & 0x7f800000;
      auVar255._0_4_ = ~uVar61 & (uint)fVar175;
      auVar255._4_4_ = ~uVar62 & (uint)fVar267;
      auVar255._8_4_ = ~uVar63 & (uint)fVar285;
      auVar255._12_4_ = ~uVar64 & (uint)fVar298;
      auVar240 = minps(auVar240,auVar255 | auVar118);
      auVar149._0_4_ = (0.0 - fVar330) * -fVar277 + (0.0 - fVar299) * -fVar258;
      auVar149._4_4_ = (0.0 - fVar331) * -fVar289 + (0.0 - fVar303) * -fVar261;
      auVar149._8_4_ = (0.0 - fVar332) * -fVar272 + (0.0 - fVar307) * -fVar276;
      auVar149._12_4_ = 0x80000000;
      auVar93._0_4_ = -auVar279._4_4_ * local_2d8 + -fVar277 * fVar133 + -fVar258 * fVar140;
      auVar93._4_4_ = -auVar279._8_4_ * fStack_2d4 + -fVar289 * fVar133 + -fVar261 * fVar140;
      auVar93._8_4_ = -auVar279._12_4_ * fStack_2d0 + -fVar272 * fVar133 + -fVar276 * fVar140;
      auVar93._12_4_ = fStack_2cc * -0.0 + fVar133 * -0.0 + fVar140 * -0.0;
      auVar75 = rcpps(auVar149,auVar93);
      fVar175 = auVar75._0_4_;
      fVar267 = auVar75._4_4_;
      fVar285 = auVar75._8_4_;
      fVar298 = auVar75._12_4_;
      fVar175 = ((1.0 - auVar93._0_4_ * fVar175) * fVar175 + fVar175) *
                -((0.0 - fVar315) * -auVar279._4_4_ + auVar149._0_4_);
      fVar267 = ((1.0 - auVar93._4_4_ * fVar267) * fVar267 + fVar267) *
                -((0.0 - fVar317) * -auVar279._8_4_ + auVar149._4_4_);
      fVar285 = ((1.0 - auVar93._8_4_ * fVar285) * fVar285 + fVar285) *
                -((0.0 - fVar318) * -auVar279._12_4_ + auVar149._8_4_);
      fVar298 = ((1.0 - auVar93._12_4_ * fVar298) * fVar298 + fVar298) * 0.0;
      uVar61 = -(uint)(auVar93._0_4_ < 0.0 || ABS(auVar93._0_4_) < 1e-18);
      uVar62 = -(uint)(auVar93._4_4_ < 0.0 || ABS(auVar93._4_4_) < 1e-18);
      uVar63 = -(uint)(auVar93._8_4_ < 0.0 || ABS(auVar93._8_4_) < 1e-18);
      uVar64 = -(uint)(auVar93._12_4_ < 0.0 || ABS(auVar93._12_4_) < 1e-18);
      auVar150._0_8_ = CONCAT44(uVar62,uVar61) & 0xff800000ff800000;
      auVar150._8_4_ = uVar63 & 0xff800000;
      auVar150._12_4_ = uVar64 & 0xff800000;
      auVar119._0_4_ = ~uVar61 & (uint)fVar175;
      auVar119._4_4_ = ~uVar62 & (uint)fVar267;
      auVar119._8_4_ = ~uVar63 & (uint)fVar285;
      auVar119._12_4_ = ~uVar64 & (uint)fVar298;
      auVar75 = maxps(auVar198,auVar119 | auVar150);
      uVar61 = -(uint)(0.0 < auVar93._0_4_ || ABS(auVar93._0_4_) < 1e-18);
      uVar62 = -(uint)(0.0 < auVar93._4_4_ || ABS(auVar93._4_4_) < 1e-18);
      uVar63 = -(uint)(0.0 < auVar93._8_4_ || ABS(auVar93._8_4_) < 1e-18);
      uVar64 = -(uint)(0.0 < auVar93._12_4_ || ABS(auVar93._12_4_) < 1e-18);
      auVar120._0_8_ = CONCAT44(uVar62,uVar61) & 0x7f8000007f800000;
      auVar120._8_4_ = uVar63 & 0x7f800000;
      auVar120._12_4_ = uVar64 & 0x7f800000;
      auVar94._0_4_ = ~uVar61 & (uint)fVar175;
      auVar94._4_4_ = ~uVar62 & (uint)fVar267;
      auVar94._8_4_ = ~uVar63 & (uint)fVar285;
      auVar94._12_4_ = ~uVar64 & (uint)fVar298;
      tp1.upper.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)minps(auVar240,auVar94 | auVar120);
      fVar298 = auVar75._12_4_;
      fVar175 = auVar75._0_4_;
      fVar267 = auVar75._4_4_;
      fVar285 = auVar75._8_4_;
      auVar324._0_4_ = -(uint)(fVar175 <= tp1.upper.field_0._0_4_) & auVar201._0_4_;
      auVar324._4_4_ = -(uint)(fVar267 <= tp1.upper.field_0._4_4_) & auVar201._4_4_;
      auVar324._8_4_ = -(uint)(fVar285 <= tp1.upper.field_0._8_4_) & auVar201._8_4_;
      auVar324._12_4_ = -(uint)(fVar298 <= tp1.upper.field_0._12_4_) & auVar201._12_4_;
      iVar45 = movmskps(iVar45,auVar324);
      uVar57 = CONCAT44(uVar47,iVar45);
      if (iVar45 != 0) {
        auVar198 = maxps(ZEXT816(0),_local_5d8);
        auVar26._4_4_ = fStack_224;
        auVar26._0_4_ = local_228;
        auVar26._8_4_ = fStack_220;
        auVar26._12_4_ = fStack_21c;
        auVar240 = minps(auVar26,_DAT_01f46a60);
        auVar171._0_12_ = ZEXT812(0);
        auVar171._12_4_ = 0.0;
        auVar215 = maxps(auVar240,auVar171);
        auVar27._4_4_ = fStack_214;
        auVar27._0_4_ = local_218;
        auVar27._8_4_ = fStack_210;
        auVar27._12_4_ = fStack_20c;
        auVar240 = minps(auVar27,_DAT_01f46a60);
        auVar240 = maxps(auVar240,auVar171);
        local_108._0_4_ = (auVar215._0_4_ + 0.0) * (float)DAT_01f4bdb0 * fVar134 + fVar142;
        local_108._4_4_ = (auVar215._4_4_ + 1.0) * DAT_01f4bdb0._4_4_ * fVar134 + fVar142;
        local_108._8_4_ = (auVar215._8_4_ + 2.0) * DAT_01f4bdb0._8_4_ * fVar134 + fVar142;
        local_108._12_4_ = (auVar215._12_4_ + 3.0) * DAT_01f4bdb0._12_4_ * fVar134 + fVar142;
        local_118[0] = (auVar240._0_4_ + 0.0) * (float)DAT_01f4bdb0 * fVar134 + fVar142;
        local_118[1] = (auVar240._4_4_ + 1.0) * DAT_01f4bdb0._4_4_ * fVar134 + fVar142;
        local_118[2] = (auVar240._8_4_ + 2.0) * DAT_01f4bdb0._8_4_ * fVar134 + fVar142;
        local_118[3] = (auVar240._12_4_ + 3.0) * DAT_01f4bdb0._12_4_ * fVar134 + fVar142;
        fVar262 = fVar262 - auVar198._0_4_ * auVar198._0_4_;
        fVar275 = fVar275 - auVar198._4_4_ * auVar198._4_4_;
        fVar288 = fVar288 - auVar198._8_4_ * auVar198._8_4_;
        fVar302 = fVar302 - auVar198._12_4_ * auVar198._12_4_;
        auVar95._0_4_ = fVar292 * fVar292 - auVar320._0_4_ * 4.0 * fVar262;
        auVar95._4_4_ = fVar300 * fVar300 - auVar320._4_4_ * 4.0 * fVar275;
        auVar95._8_4_ = fVar304 * fVar304 - auVar320._8_4_ * 4.0 * fVar288;
        auVar95._12_4_ = fVar308 * fVar308 - auVar320._12_4_ * 4.0 * fVar302;
        auVar280._4_4_ = -(uint)(0.0 <= auVar95._4_4_);
        auVar280._0_4_ = -(uint)(0.0 <= auVar95._0_4_);
        auVar280._8_4_ = -(uint)(0.0 <= auVar95._8_4_);
        auVar280._12_4_ = -(uint)(0.0 <= auVar95._12_4_);
        iVar45 = movmskps(iVar45,auVar280);
        if (iVar45 == 0) {
          _local_5d8 = ZEXT816(0);
          fVar265 = 0.0;
          fVar282 = 0.0;
          fVar290 = 0.0;
          fVar306 = 0.0;
          fVar134 = 0.0;
          fVar236 = 0.0;
          fVar263 = 0.0;
          fVar258 = 0.0;
          fVar310 = 0.0;
          fVar314 = 0.0;
          fVar316 = 0.0;
          fVar176 = 0.0;
          _local_518 = ZEXT816(0);
          iVar45 = 0;
          auVar231 = _DAT_01f45a40;
          auVar245 = _DAT_01f45a30;
        }
        else {
          auVar198 = sqrtps(local_108,auVar95);
          auVar121._0_4_ = auVar320._0_4_ + auVar320._0_4_;
          auVar121._4_4_ = auVar320._4_4_ + auVar320._4_4_;
          auVar121._8_4_ = auVar320._8_4_ + auVar320._8_4_;
          auVar121._12_4_ = auVar320._12_4_ + auVar320._12_4_;
          auVar240 = rcpps(_DAT_01f4bdb0,auVar121);
          fVar260 = auVar240._0_4_;
          fVar261 = auVar240._4_4_;
          fVar266 = auVar240._8_4_;
          fVar276 = auVar240._12_4_;
          fVar260 = ((float)DAT_01f46a60 - auVar121._0_4_ * fVar260) * fVar260 + fVar260;
          fVar261 = (DAT_01f46a60._4_4_ - auVar121._4_4_ * fVar261) * fVar261 + fVar261;
          fVar266 = (DAT_01f46a60._8_4_ - auVar121._8_4_ * fVar266) * fVar266 + fVar266;
          fVar276 = (DAT_01f46a60._12_4_ - auVar121._12_4_ * fVar276) * fVar276 + fVar276;
          fVar284 = (local_338 - auVar198._0_4_) * fVar260;
          fVar289 = (fStack_334 - auVar198._4_4_) * fVar261;
          fVar269 = (fStack_330 - auVar198._8_4_) * fVar266;
          fVar272 = (fStack_32c - auVar198._12_4_) * fVar276;
          fVar260 = (auVar198._0_4_ - fVar292) * fVar260;
          fVar261 = (auVar198._4_4_ - fVar300) * fVar261;
          fVar266 = (auVar198._8_4_ - fVar304) * fVar266;
          fVar276 = (auVar198._12_4_ - fVar308) * fVar276;
          fVar283 = (fVar207 * fVar284 + (float)local_328._0_4_) * fVar265;
          fVar268 = (fVar209 * fVar289 + (float)local_328._4_4_) * fVar282;
          fVar286 = (fVar224 * fVar269 + fStack_320) * fVar290;
          fVar277 = (fVar226 * fVar272 + fStack_31c) * fVar306;
          fVar134 = local_2d8 * fVar284 - ((float)local_318._0_4_ * fVar283 + fVar311);
          fVar236 = fStack_2d4 * fVar289 - ((float)local_318._4_4_ * fVar268 + fVar315);
          fVar263 = fStack_2d0 * fVar269 - (fStack_310 * fVar286 + fVar317);
          fVar258 = fStack_2cc * fVar272 - (fStack_30c * fVar277 + fVar318);
          fVar310 = fVar133 * fVar284 - (fVar177 * fVar283 + fVar319);
          fVar314 = fVar133 * fVar289 - (fVar179 * fVar268 + fVar330);
          fVar316 = fVar133 * fVar269 - (fVar204 * fVar286 + fVar331);
          fVar176 = fVar133 * fVar272 - (fVar206 * fVar277 + fVar332);
          local_518._4_4_ = fVar140 * fVar289 - (fVar268 * fVar253 + fVar299);
          local_518._0_4_ = fVar140 * fVar284 - (fVar283 * fVar227 + fVar291);
          fStack_510 = fVar140 * fVar269 - (fVar286 * fVar233 + fVar303);
          fStack_50c = fVar140 * fVar272 - (fVar277 * fVar235 + fVar307);
          fVar265 = (fVar207 * fVar260 + (float)local_328._0_4_) * fVar265;
          fVar282 = (fVar209 * fVar261 + (float)local_328._4_4_) * fVar282;
          fVar290 = (fVar224 * fVar266 + fStack_320) * fVar290;
          fVar306 = (fVar226 * fVar276 + fStack_31c) * fVar306;
          local_5d8._4_4_ = fStack_2d4 * fVar261 - ((float)local_318._4_4_ * fVar282 + fVar315);
          local_5d8._0_4_ = local_2d8 * fVar260 - ((float)local_318._0_4_ * fVar265 + fVar311);
          fStack_5d0 = fStack_2d0 * fVar266 - (fStack_310 * fVar290 + fVar317);
          fStack_5cc = fStack_2cc * fVar276 - (fStack_30c * fVar306 + fVar318);
          auVar171._0_4_ = fVar133 * fVar260 - (fVar177 * fVar265 + fVar319);
          auVar171._4_4_ = fVar133 * fVar261 - (fVar179 * fVar282 + fVar330);
          auVar171._8_4_ = fVar133 * fVar266 - (fVar204 * fVar290 + fVar331);
          auVar171._12_4_ = fVar133 * fVar276 - (fVar206 * fVar306 + fVar332);
          bVar60 = 0.0 <= auVar95._0_4_;
          uVar61 = -(uint)bVar60;
          bVar12 = 0.0 <= auVar95._4_4_;
          uVar62 = -(uint)bVar12;
          bVar13 = 0.0 <= auVar95._8_4_;
          uVar63 = -(uint)bVar13;
          bVar14 = 0.0 <= auVar95._12_4_;
          uVar64 = -(uint)bVar14;
          fVar265 = fVar140 * fVar260 - (fVar265 * fVar227 + fVar291);
          fVar282 = fVar140 * fVar261 - (fVar282 * fVar253 + fVar299);
          fVar290 = fVar140 * fVar266 - (fVar290 * fVar233 + fVar303);
          fVar306 = fVar140 * fVar276 - (fVar306 * fVar235 + fVar307);
          auVar297._0_4_ = (uint)fVar284 & uVar61;
          auVar297._4_4_ = (uint)fVar289 & uVar62;
          auVar297._8_4_ = (uint)fVar269 & uVar63;
          auVar297._12_4_ = (uint)fVar272 & uVar64;
          auVar245._0_8_ = CONCAT44(~uVar62,~uVar61) & 0x7f8000007f800000;
          auVar245._8_4_ = ~uVar63 & 0x7f800000;
          auVar245._12_4_ = ~uVar64 & 0x7f800000;
          auVar245 = auVar245 | auVar297;
          auVar217._0_4_ = (uint)fVar260 & uVar61;
          auVar217._4_4_ = (uint)fVar261 & uVar62;
          auVar217._8_4_ = (uint)fVar266 & uVar63;
          auVar217._12_4_ = (uint)fVar276 & uVar64;
          auVar231._0_8_ = CONCAT44(~uVar62,~uVar61) & 0xff800000ff800000;
          auVar231._8_4_ = ~uVar63 & 0xff800000;
          auVar231._12_4_ = ~uVar64 & 0xff800000;
          auVar231 = auVar231 | auVar217;
          auVar25._4_4_ = fStack_2e4;
          auVar25._0_4_ = local_2e8;
          auVar25._8_4_ = fStack_2e0;
          auVar25._12_4_ = fStack_2dc;
          auVar240 = maxps(auVar25,auVar333);
          fVar177 = auVar240._0_4_ * 1.9073486e-06;
          fVar179 = auVar240._4_4_ * 1.9073486e-06;
          fVar204 = auVar240._8_4_ * 1.9073486e-06;
          fVar206 = auVar240._12_4_ * 1.9073486e-06;
          auVar218._0_4_ = -(uint)(fVar271 < fVar177 && bVar60);
          auVar218._4_4_ = -(uint)(fVar287 < fVar179 && bVar12);
          auVar218._8_4_ = -(uint)(fVar270 < fVar204 && bVar13);
          auVar218._12_4_ = -(uint)(fVar274 < fVar206 && bVar14);
          iVar45 = movmskps(iVar45,auVar218);
          if (iVar45 != 0) {
            uVar61 = -(uint)(fVar262 <= 0.0);
            uVar62 = -(uint)(fVar275 <= 0.0);
            uVar63 = -(uint)(fVar288 <= 0.0);
            uVar64 = -(uint)(fVar302 <= 0.0);
            auVar256._0_4_ = (uVar61 & (uint)DAT_01f45a40 | ~uVar61 & 0x7f800000) & auVar218._0_4_;
            auVar256._4_4_ = (uVar62 & DAT_01f45a40._4_4_ | ~uVar62 & 0x7f800000) & auVar218._4_4_;
            auVar256._8_4_ = (uVar63 & DAT_01f45a40._8_4_ | ~uVar63 & 0x7f800000) & auVar218._8_4_;
            auVar256._12_4_ =
                 (uVar64 & DAT_01f45a40._12_4_ | ~uVar64 & 0x7f800000) & auVar218._12_4_;
            auVar264._0_4_ = ~auVar218._0_4_ & auVar245._0_4_;
            auVar264._4_4_ = ~auVar218._4_4_ & auVar245._4_4_;
            auVar264._8_4_ = ~auVar218._8_4_ & auVar245._8_4_;
            auVar264._12_4_ = ~auVar218._12_4_ & auVar245._12_4_;
            auVar249._0_4_ = (uVar61 & 0x7f800000 | ~uVar61 & (uint)DAT_01f45a40) & auVar218._0_4_;
            auVar249._4_4_ = (uVar62 & 0x7f800000 | ~uVar62 & DAT_01f45a40._4_4_) & auVar218._4_4_;
            auVar249._8_4_ = (uVar63 & 0x7f800000 | ~uVar63 & DAT_01f45a40._8_4_) & auVar218._8_4_;
            auVar249._12_4_ =
                 (uVar64 & 0x7f800000 | ~uVar64 & DAT_01f45a40._12_4_) & auVar218._12_4_;
            auVar222._0_4_ = ~auVar218._0_4_ & auVar231._0_4_;
            auVar222._4_4_ = ~auVar218._4_4_ & auVar231._4_4_;
            auVar222._8_4_ = ~auVar218._8_4_ & auVar231._8_4_;
            auVar222._12_4_ = ~auVar218._12_4_ & auVar231._12_4_;
            auVar280._4_4_ = -(uint)((fVar179 <= fVar287 || fVar275 <= 0.0) && bVar12);
            auVar280._0_4_ = -(uint)((fVar177 <= fVar271 || fVar262 <= 0.0) && bVar60);
            auVar280._8_4_ = -(uint)((fVar204 <= fVar270 || fVar288 <= 0.0) && bVar13);
            auVar280._12_4_ = -(uint)((fVar206 <= fVar274 || fVar302 <= 0.0) && bVar14);
            auVar231 = auVar222 | auVar249;
            auVar245 = auVar264 | auVar256;
          }
        }
        fVar262 = (ray->dir).field_0.m128[0];
        fVar275 = (ray->dir).field_0.m128[1];
        fVar288 = (ray->dir).field_0.m128[2];
        auVar240 = minps((undefined1  [16])tp1.upper.field_0,auVar245);
        aVar246 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar75,auVar231);
        tp1.lower.field_0 = aVar246;
        local_328._0_4_ = -(uint)(fVar175 <= auVar240._0_4_) & auVar324._0_4_;
        local_328._4_4_ = -(uint)(fVar267 <= auVar240._4_4_) & auVar324._4_4_;
        fStack_320 = (float)(-(uint)(fVar285 <= auVar240._8_4_) & auVar324._8_4_);
        fStack_31c = (float)(-(uint)(fVar298 <= auVar240._12_4_) & auVar324._12_4_);
        local_318 = (undefined1  [8])
                    CONCAT44(-(uint)(aVar246.v[1] <= tp1.upper.field_0._4_4_) & auVar324._4_4_,
                             -(uint)(aVar246.v[0] <= tp1.upper.field_0._0_4_) & auVar324._0_4_);
        fStack_310 = (float)(-(uint)(aVar246.v[2] <= tp1.upper.field_0._8_4_) & auVar324._8_4_);
        fStack_30c = (float)(-(uint)(aVar246.v[3] <= tp1.upper.field_0._12_4_) & auVar324._12_4_);
        auVar96._8_4_ = fStack_310;
        auVar96._0_8_ = local_318;
        auVar96._12_4_ = fStack_30c;
        iVar45 = movmskps(iVar45,auVar96 | _local_328);
        uVar57 = CONCAT44(uVar47,iVar45);
        if (iVar45 != 0) {
          local_338 = (float)local_61c;
          fStack_334 = (float)local_61c;
          fStack_330 = (float)local_61c;
          fStack_32c = (float)local_61c;
          auVar122._0_4_ =
               -(uint)((int)local_61c <
                      ((int)((-(uint)(0.3 <= ABS((float)local_518._0_4_ * fVar288 +
                                                 fVar310 * fVar275 + fVar134 * fVar262)) &
                             auVar280._0_4_) << 0x1f) >> 0x1f) + 4);
          auVar122._4_4_ =
               -(uint)((int)local_61c <
                      ((int)((-(uint)(0.3 <= ABS((float)local_518._4_4_ * fVar288 +
                                                 fVar314 * fVar275 + fVar236 * fVar262)) &
                             auVar280._4_4_) << 0x1f) >> 0x1f) + 4);
          auVar122._8_4_ =
               -(uint)((int)local_61c <
                      ((int)((-(uint)(0.3 <= ABS(fStack_510 * fVar288 + fVar316 * fVar275 +
                                                 fVar263 * fVar262)) & auVar280._8_4_) << 0x1f) >>
                      0x1f) + 4);
          auVar122._12_4_ =
               -(uint)((int)local_61c <
                      ((int)((-(uint)(0.3 <= ABS(fStack_50c * fVar288 + fVar176 * fVar275 +
                                                 fVar258 * fVar262)) & auVar280._12_4_) << 0x1f) >>
                      0x1f) + 4);
          auVar97 = ~auVar122 & _local_328;
          while( true ) {
            vVar44.field_0 = tp1.lower.field_0;
            local_2b8 = auVar97;
            uVar47 = (undefined4)(uVar57 >> 0x20);
            iVar45 = movmskps((int)uVar57,auVar97);
            lVar49 = CONCAT44(uVar47,iVar45);
            if (iVar45 == 0) break;
            auVar198 = ~auVar97 & _DAT_01f45a30 | auVar97 & auVar75;
            auVar151._4_4_ = auVar198._0_4_;
            auVar151._0_4_ = auVar198._4_4_;
            auVar151._8_4_ = auVar198._12_4_;
            auVar151._12_4_ = auVar198._8_4_;
            auVar240 = minps(auVar151,auVar198);
            auVar123._0_8_ = auVar240._8_8_;
            auVar123._8_4_ = auVar240._0_4_;
            auVar123._12_4_ = auVar240._4_4_;
            auVar240 = minps(auVar123,auVar240);
            auVar124._0_8_ =
                 CONCAT44(-(uint)(auVar240._4_4_ == auVar198._4_4_) & auVar97._4_4_,
                          -(uint)(auVar240._0_4_ == auVar198._0_4_) & auVar97._0_4_);
            auVar124._8_4_ = -(uint)(auVar240._8_4_ == auVar198._8_4_) & auVar97._8_4_;
            auVar124._12_4_ = -(uint)(auVar240._12_4_ == auVar198._12_4_) & auVar97._12_4_;
            iVar45 = movmskps(iVar45,auVar124);
            if (iVar45 != 0) {
              auVar97._8_4_ = auVar124._8_4_;
              auVar97._0_8_ = auVar124._0_8_;
              auVar97._12_4_ = auVar124._12_4_;
            }
            uVar46 = movmskps(iVar45,auVar97);
            uVar59 = CONCAT44(uVar47,uVar46);
            uVar57 = 0;
            if (uVar59 != 0) {
              for (; (uVar59 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
              }
            }
            *(undefined4 *)(local_2b8 + uVar57 * 4) = 0;
            fVar302 = (ray->dir).field_0.m128[0];
            fVar310 = (ray->dir).field_0.m128[1];
            fVar314 = (ray->dir).field_0.m128[2];
            fVar316 = (ray->dir).field_0.m128[3];
            auVar16._4_4_ = fVar225;
            auVar16._0_4_ = fVar223;
            auVar16._8_4_ = fVar232;
            auVar16._12_4_ = fVar178;
            auVar22._4_4_ = fVar205;
            auVar22._0_4_ = fVar203;
            auVar22._8_4_ = fVar234;
            auVar22._12_4_ = fVar237;
            auVar198 = minps(auVar16,auVar22);
            auVar215 = maxps(auVar16,auVar22);
            auVar20._4_4_ = fVar251;
            auVar20._0_4_ = fVar250;
            auVar20._8_4_ = fVar252;
            auVar20._12_4_ = fVar257;
            auVar18._4_4_ = fVar131;
            auVar18._0_4_ = fVar141;
            auVar18._8_4_ = fVar132;
            auVar18._12_4_ = fVar259;
            auVar240 = minps(auVar20,auVar18);
            auVar198 = minps(auVar198,auVar240);
            auVar240 = maxps(auVar20,auVar18);
            auVar215 = maxps(auVar215,auVar240);
            auVar152._0_8_ = auVar198._0_8_ & 0x7fffffff7fffffff;
            auVar152._8_4_ = auVar198._8_4_ & 0x7fffffff;
            auVar152._12_4_ = auVar198._12_4_ & 0x7fffffff;
            auVar98._0_8_ = auVar215._0_8_ & 0x7fffffff7fffffff;
            auVar98._8_4_ = auVar215._8_4_ & 0x7fffffff;
            auVar98._12_4_ = ABS(auVar215._12_4_);
            auVar240 = maxps(auVar152,auVar98);
            fVar176 = auVar240._4_4_;
            if (auVar240._4_4_ <= auVar240._0_4_) {
              fVar176 = auVar240._0_4_;
            }
            auVar153._8_8_ = auVar240._8_8_;
            auVar153._0_8_ = auVar240._8_8_;
            if (auVar240._8_4_ <= fVar176) {
              auVar153._0_4_ = fVar176;
            }
            fVar177 = auVar153._0_4_ * 1.9073486e-06;
            fVar176 = *(float *)(local_108 + uVar57 * 4);
            fVar134 = local_118[uVar57 - 8];
            for (uVar59 = 0; uVar59 != 5; uVar59 = uVar59 + 1) {
              fVar209 = SQRT(fVar314 * fVar314 + fVar310 * fVar310 + fVar302 * fVar302) *
                        1.9073486e-06 * fVar134;
              fVar179 = 1.0 - fVar176;
              fVar206 = fVar203 * fVar179 + fVar250 * fVar176;
              fVar207 = fVar205 * fVar179 + fVar251 * fVar176;
              fVar224 = fVar234 * fVar179 + fVar252 * fVar176;
              fVar227 = fVar237 * fVar179 + fVar257 * fVar176;
              fVar226 = (fVar223 * fVar179 + fVar203 * fVar176) * fVar179 + fVar176 * fVar206;
              fVar253 = (fVar225 * fVar179 + fVar205 * fVar176) * fVar179 + fVar176 * fVar207;
              fVar233 = (fVar232 * fVar179 + fVar234 * fVar176) * fVar179 + fVar176 * fVar224;
              fVar204 = (fVar178 * fVar179 + fVar237 * fVar176) * fVar179 + fVar176 * fVar227;
              fVar236 = fVar206 * fVar179 + (fVar250 * fVar179 + fVar141 * fVar176) * fVar176;
              fVar258 = fVar207 * fVar179 + (fVar251 * fVar179 + fVar131 * fVar176) * fVar176;
              fVar261 = fVar224 * fVar179 + (fVar252 * fVar179 + fVar132 * fVar176) * fVar176;
              fVar206 = fVar227 * fVar179 + (fVar257 * fVar179 + fVar259 * fVar176) * fVar176;
              fVar283 = fVar179 * fVar204 + fVar176 * fVar206;
              fVar263 = (fVar236 - fVar226) * 3.0;
              fVar260 = (fVar258 - fVar253) * 3.0;
              fVar266 = (fVar261 - fVar233) * 3.0;
              fVar276 = (fVar206 - fVar204) * 3.0;
              fVar204 = fVar179 * 6.0;
              fVar227 = (fVar176 - (fVar179 + fVar179)) * 6.0;
              fVar235 = (fVar179 - (fVar176 + fVar176)) * 6.0;
              fVar224 = fVar176 * 6.0;
              fVar206 = fVar204 * fVar223 +
                        fVar227 * fVar203 + fVar235 * fVar250 + fVar224 * fVar141;
              fVar207 = fVar204 * fVar225 +
                        fVar227 * fVar205 + fVar235 * fVar251 + fVar224 * fVar131;
              fVar204 = fVar204 * fVar232 +
                        fVar227 * fVar234 + fVar235 * fVar252 + fVar224 * fVar132;
              fVar224 = (fVar134 * fVar302 + 0.0) - (fVar179 * fVar226 + fVar176 * fVar236);
              fVar226 = (fVar134 * fVar310 + 0.0) - (fVar179 * fVar253 + fVar176 * fVar258);
              fVar227 = (fVar134 * fVar314 + 0.0) - (fVar179 * fVar233 + fVar176 * fVar261);
              fVar253 = (fVar134 * fVar316 + 0.0) - fVar283;
              fVar179 = fVar226 * fVar226;
              fStack_3b0 = fVar227 * fVar227;
              fStack_3ac = fVar253 * fVar253;
              local_3b8._0_4_ = fVar179 + fVar224 * fVar224 + fStack_3b0;
              local_3b8._4_4_ = fVar179 + fVar179 + fStack_3ac;
              fStack_3b0 = fVar179 + fStack_3b0 + fStack_3b0;
              fStack_3ac = fVar179 + fStack_3ac + fStack_3ac;
              fVar179 = fVar177;
              if (fVar177 <= fVar209) {
                fVar179 = fVar209;
              }
              fVar233 = fVar260 * fVar260 + fVar263 * fVar263 + fVar266 * fVar266;
              auVar240 = ZEXT416((uint)fVar233);
              auVar198 = rsqrtss(ZEXT416((uint)fVar233),auVar240);
              fVar209 = auVar198._0_4_;
              fVar235 = fVar209 * 1.5 - fVar209 * fVar209 * fVar233 * 0.5 * fVar209;
              fVar277 = fVar263 * fVar235;
              fVar284 = fVar260 * fVar235;
              fVar287 = fVar266 * fVar235;
              fVar289 = fVar276 * fVar235;
              fVar268 = fVar266 * fVar204 + fVar260 * fVar207 + fVar263 * fVar206;
              auVar240 = rcpss(auVar240,auVar240);
              fVar209 = (2.0 - fVar233 * auVar240._0_4_) * auVar240._0_4_;
              fVar236 = fVar226 * fVar284;
              fVar258 = fVar227 * fVar287;
              fVar261 = fVar253 * fVar289;
              fVar286 = fVar236 + fVar224 * fVar277 + fVar258;
              fVar271 = fVar236 + fVar236 + fVar261;
              fVar258 = fVar236 + fVar258 + fVar258;
              fVar261 = fVar236 + fVar261 + fVar261;
              fVar236 = (SQRT((float)local_3b8._0_4_) + 1.0) * (fVar177 / SQRT(fVar233)) +
                        SQRT((float)local_3b8._0_4_) * fVar177 + fVar179;
              auVar325._0_4_ = fVar277 * -fVar263;
              auVar325._4_4_ = fVar284 * -fVar260;
              auVar325._8_4_ = fVar287 * -fVar266;
              auVar325._12_4_ = fVar289 * -fVar276;
              auVar326._8_8_ = auVar325._8_8_;
              auVar326._0_8_ = auVar326._8_8_;
              auVar327._4_12_ = auVar326._4_12_;
              auVar327._0_4_ =
                   auVar325._8_4_ + auVar325._4_4_ + auVar325._0_4_ +
                   fVar209 * (fVar233 * fVar204 - fVar268 * fVar266) * fVar235 * fVar227 +
                   fVar209 * (fVar233 * fVar207 - fVar268 * fVar260) * fVar235 * fVar226 +
                   fVar209 * (fVar233 * fVar206 - fVar268 * fVar263) * fVar235 * fVar224;
              auVar329._0_8_ = auVar327._0_8_;
              fVar207 = fVar314 * fVar287 + fVar310 * fVar284 + fVar302 * fVar277;
              fVar204 = (float)local_3b8._0_4_ - fVar286 * fVar286;
              auVar219._0_8_ = CONCAT44((float)local_3b8._4_4_ - fVar271 * fVar271,fVar204);
              auVar219._8_4_ = fStack_3b0 - fVar258 * fVar258;
              auVar219._12_4_ = fStack_3ac - fVar261 * fVar261;
              fVar209 = -fVar276 * fVar253;
              auVar125._8_4_ = auVar219._8_4_;
              auVar125._0_8_ = auVar219._0_8_;
              auVar125._12_4_ = auVar219._12_4_;
              auVar240 = rsqrtss(auVar125,auVar219);
              fVar206 = auVar240._0_4_;
              fVar206 = fVar206 * 1.5 - fVar206 * fVar206 * fVar204 * 0.5 * fVar206;
              if (fVar204 < 0.0) {
                fVar204 = sqrtf(fVar204);
                uVar57 = extraout_RAX;
                pRVar54 = extraout_RDX;
              }
              else {
                fVar204 = SQRT(fVar204);
              }
              fVar204 = fVar204 - fVar283;
              fVar233 = ((-fVar266 * fVar227 + -fVar260 * fVar226 + -fVar263 * fVar224) -
                        fVar286 * auVar327._0_4_) * fVar206 - fVar276;
              fVar206 = ((fVar314 * fVar227 + fVar310 * fVar226 + fVar302 * fVar224) -
                        fVar286 * fVar207) * fVar206;
              auVar248._0_8_ = CONCAT44(fVar209,fVar233) ^ 0x8000000080000000;
              auVar154._0_4_ = auVar327._0_4_ * fVar206 - fVar207 * fVar233;
              auVar248._8_4_ = -fVar209;
              auVar248._12_4_ = fVar316 * fVar253;
              auVar247._8_8_ = auVar248._8_8_;
              auVar247._0_8_ = CONCAT44(fVar206,fVar233) ^ 0x80000000;
              auVar154._4_4_ = auVar154._0_4_;
              auVar154._8_4_ = auVar154._0_4_;
              auVar154._12_4_ = auVar154._0_4_;
              auVar240 = divps(auVar247,auVar154);
              auVar329._8_4_ = auVar325._12_4_;
              auVar329._12_4_ = -(fVar316 * fVar289);
              auVar328._8_8_ = auVar329._8_8_;
              auVar328._0_8_ = CONCAT44(fVar207,auVar327._0_4_) ^ 0x8000000000000000;
              auVar198 = divps(auVar328,auVar154);
              fVar134 = fVar134 - (fVar204 * auVar198._0_4_ + fVar286 * auVar240._0_4_);
              fVar176 = fVar176 - (fVar204 * auVar198._4_4_ + fVar286 * auVar240._4_4_);
              if ((ABS(fVar286) < fVar236) &&
                 (ABS(fVar204) < auVar215._12_4_ * 1.9073486e-06 + fVar179 + fVar236)) {
                bVar60 = uVar59 < 5;
                fVar134 = local_308._0_4_ + fVar134;
                uVar57 = 0;
                if (((ray->org).field_0.m128[3] <= fVar134) &&
                   (fVar302 = ray->tfar, fVar134 <= fVar302)) {
                  uVar57 = 0;
                  if ((0.0 <= fVar176) && (uVar57 = 0, fVar176 <= 1.0)) {
                    auVar240 = rsqrtss(_local_3b8,_local_3b8);
                    fVar310 = auVar240._0_4_;
                    pGVar9 = (context->scene->geometries).items[(long)pRVar52].ptr;
                    if ((pGVar9->mask & ray->mask) == 0) {
                      uVar57 = 0;
                      pRVar54 = pRVar52;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (uVar57 = CONCAT71((int7)((ulong)context->args >> 8),1),
                            pRVar54 = pRVar52, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0))
                    {
                      fVar310 = fVar310 * 1.5 +
                                fVar310 * fVar310 * (float)local_3b8._0_4_ * -0.5 * fVar310;
                      fVar224 = fVar224 * fVar310;
                      fVar226 = fVar226 * fVar310;
                      fVar227 = fVar227 * fVar310;
                      fVar310 = fVar276 * fVar224 + fVar263;
                      fVar314 = fVar276 * fVar226 + fVar260;
                      fVar316 = fVar276 * fVar227 + fVar266;
                      fVar177 = fVar226 * fVar263 - fVar260 * fVar224;
                      fVar179 = fVar227 * fVar260 - fVar266 * fVar226;
                      fVar204 = fVar224 * fVar266 - fVar263 * fVar227;
                      vu0.field_0._0_8_ =
                           CONCAT44(fVar310 * fVar177 - fVar179 * fVar316,
                                    fVar316 * fVar204 - fVar177 * fVar314);
                      vu0.field_0.v[2] = fVar314 * fVar179 - fVar204 * fVar310;
                      vu0.field_0.v[3] = fVar176;
                      ray->tfar = fVar134;
                      local_348._0_4_ = 0xffffffff;
                      args.geometryUserPtr = pGVar9->userPtr;
                      args.valid = (int *)local_348;
                      args.context = context->user;
                      args.hit = (RTCHitN *)&vu0;
                      args.N = 1;
                      pRVar54 = context;
                      args.ray = (RTCRayN *)ray;
                      if (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00318221:
                        p_Var50 = context->args->filter;
                        if ((p_Var50 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var50)(&args);
                          p_Var50 = (RTCFilterFunctionN)args.valid;
                          pRVar54 = extraout_RDX_01;
                          if (*args.valid == 0) goto LAB_00318268;
                        }
                        uVar57 = CONCAT71((int7)((ulong)p_Var50 >> 8),1);
                      }
                      else {
                        (*pGVar9->occlusionFilterN)(&args);
                        pRVar54 = extraout_RDX_00;
                        if (*args.valid != 0) goto LAB_00318221;
LAB_00318268:
                        ray->tfar = fVar302;
                        uVar57 = 0;
                      }
                    }
                  }
                }
                goto LAB_00318005;
              }
            }
            bVar60 = false;
LAB_00318005:
            bVar55 = bVar55 | bVar60 & (byte)uVar57;
            fVar302 = ray->tfar;
            auVar97._0_4_ = -(uint)(fVar208 + fVar175 <= fVar302) & local_2b8._0_4_;
            auVar97._4_4_ = -(uint)(fVar208 + fVar267 <= fVar302) & local_2b8._4_4_;
            auVar97._8_4_ = -(uint)(fVar208 + fVar285 <= fVar302) & local_2b8._8_4_;
            auVar97._12_4_ = -(uint)(fVar208 + fVar298 <= fVar302) & local_2b8._12_4_;
          }
          fVar302 = ray->tfar;
          auVar155._0_4_ = -(uint)(aVar246.v[0] + fVar208 <= fVar302) & local_318._0_4_;
          auVar155._4_4_ = -(uint)(aVar246.v[1] + fVar208 <= fVar302) & local_318._4_4_;
          auVar155._8_4_ = -(uint)(aVar246.v[2] + fVar208 <= fVar302) & (uint)fStack_310;
          auVar155._12_4_ = -(uint)(aVar246.v[3] + fVar208 <= fVar302) & (uint)fStack_30c;
          auVar126._0_4_ =
               -(uint)((int)local_338 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_5d8._0_4_ * fVar262 +
                                                 auVar171._0_4_ * fVar275 + fVar265 * fVar288)) &
                             auVar280._0_4_) << 0x1f) >> 0x1f) + 4);
          auVar126._4_4_ =
               -(uint)((int)fStack_334 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_5d8._4_4_ * fVar262 +
                                                 auVar171._4_4_ * fVar275 + fVar282 * fVar288)) &
                             auVar280._4_4_) << 0x1f) >> 0x1f) + 4);
          auVar126._8_4_ =
               -(uint)((int)fStack_330 <
                      ((int)((-(uint)(0.3 <= ABS(fStack_5d0 * fVar262 +
                                                 auVar171._8_4_ * fVar275 + fVar290 * fVar288)) &
                             auVar280._8_4_) << 0x1f) >> 0x1f) + 4);
          auVar126._12_4_ =
               -(uint)((int)fStack_32c <
                      ((int)((-(uint)(0.3 <= ABS(fStack_5cc * fVar262 +
                                                 auVar171._12_4_ * fVar275 + fVar306 * fVar288)) &
                             auVar280._12_4_) << 0x1f) >> 0x1f) + 4);
          auVar127 = ~auVar126 & auVar155;
          fVar262 = fVar208 + tp1.lower.field_0.v[0];
          fVar265 = fVar208 + tp1.lower.field_0.v[1];
          fVar275 = fVar208 + tp1.lower.field_0.v[2];
          fVar282 = fVar208 + tp1.lower.field_0.v[3];
          while( true ) {
            local_348 = auVar127;
            iVar45 = movmskps((int)lVar49,auVar127);
            if (iVar45 == 0) break;
            auVar240 = ~auVar127 & _DAT_01f45a30 | auVar127 & (undefined1  [16])vVar44.field_0;
            auVar156._4_4_ = auVar240._0_4_;
            auVar156._0_4_ = auVar240._4_4_;
            auVar156._8_4_ = auVar240._12_4_;
            auVar156._12_4_ = auVar240._8_4_;
            auVar75 = minps(auVar156,auVar240);
            auVar99._0_8_ = auVar75._8_8_;
            auVar99._8_4_ = auVar75._0_4_;
            auVar99._12_4_ = auVar75._4_4_;
            auVar75 = minps(auVar99,auVar75);
            auVar100._0_8_ =
                 CONCAT44(-(uint)(auVar75._4_4_ == auVar240._4_4_) & auVar127._4_4_,
                          -(uint)(auVar75._0_4_ == auVar240._0_4_) & auVar127._0_4_);
            auVar100._8_4_ = -(uint)(auVar75._8_4_ == auVar240._8_4_) & auVar127._8_4_;
            auVar100._12_4_ = -(uint)(auVar75._12_4_ == auVar240._12_4_) & auVar127._12_4_;
            iVar45 = movmskps(iVar45,auVar100);
            if (iVar45 != 0) {
              auVar127._8_4_ = auVar100._8_4_;
              auVar127._0_8_ = auVar100._0_8_;
              auVar127._12_4_ = auVar100._12_4_;
            }
            uVar47 = movmskps(iVar45,auVar127);
            uVar57 = CONCAT44((int)((ulong)lVar49 >> 0x20),uVar47);
            lVar49 = 0;
            if (uVar57 != 0) {
              for (; (uVar57 >> lVar49 & 1) == 0; lVar49 = lVar49 + 1) {
              }
            }
            *(undefined4 *)(local_348 + lVar49 * 4) = 0;
            fVar288 = (ray->dir).field_0.m128[0];
            fVar290 = (ray->dir).field_0.m128[1];
            fVar302 = (ray->dir).field_0.m128[2];
            fVar306 = (ray->dir).field_0.m128[3];
            auVar17._4_4_ = fVar225;
            auVar17._0_4_ = fVar223;
            auVar17._8_4_ = fVar232;
            auVar17._12_4_ = fVar178;
            auVar23._4_4_ = fVar205;
            auVar23._0_4_ = fVar203;
            auVar23._8_4_ = fVar234;
            auVar23._12_4_ = fVar237;
            auVar240 = minps(auVar17,auVar23);
            auVar198 = maxps(auVar17,auVar23);
            auVar21._4_4_ = fVar251;
            auVar21._0_4_ = fVar250;
            auVar21._8_4_ = fVar252;
            auVar21._12_4_ = fVar257;
            auVar19._4_4_ = fVar131;
            auVar19._0_4_ = fVar141;
            auVar19._8_4_ = fVar132;
            auVar19._12_4_ = fVar259;
            auVar75 = minps(auVar21,auVar19);
            auVar240 = minps(auVar240,auVar75);
            auVar75 = maxps(auVar21,auVar19);
            auVar198 = maxps(auVar198,auVar75);
            auVar157._0_8_ = auVar240._0_8_ & 0x7fffffff7fffffff;
            auVar157._8_4_ = auVar240._8_4_ & 0x7fffffff;
            auVar157._12_4_ = auVar240._12_4_ & 0x7fffffff;
            auVar101._0_8_ = auVar198._0_8_ & 0x7fffffff7fffffff;
            auVar101._8_4_ = auVar198._8_4_ & 0x7fffffff;
            auVar101._12_4_ = ABS(auVar198._12_4_);
            auVar75 = maxps(auVar157,auVar101);
            fVar310 = auVar75._4_4_;
            if (auVar75._4_4_ <= auVar75._0_4_) {
              fVar310 = auVar75._0_4_;
            }
            auVar158._8_8_ = auVar75._8_8_;
            auVar158._0_8_ = auVar75._8_8_;
            if (auVar75._8_4_ <= fVar310) {
              auVar158._0_4_ = fVar310;
            }
            fVar316 = auVar158._0_4_ * 1.9073486e-06;
            fVar310 = local_118[lVar49];
            fVar314 = tp1.upper.field_0.v[lVar49];
            for (uVar57 = 0; uVar57 != 5; uVar57 = uVar57 + 1) {
              fVar204 = SQRT(fVar302 * fVar302 + fVar290 * fVar290 + fVar288 * fVar288) *
                        1.9073486e-06 * fVar314;
              fVar176 = 1.0 - fVar310;
              fVar177 = fVar203 * fVar176 + fVar250 * fVar310;
              fVar179 = fVar205 * fVar176 + fVar251 * fVar310;
              fVar206 = fVar234 * fVar176 + fVar252 * fVar310;
              fVar209 = fVar237 * fVar176 + fVar257 * fVar310;
              fVar207 = (fVar223 * fVar176 + fVar203 * fVar310) * fVar176 + fVar310 * fVar177;
              fVar224 = (fVar225 * fVar176 + fVar205 * fVar310) * fVar176 + fVar310 * fVar179;
              fVar226 = (fVar232 * fVar176 + fVar234 * fVar310) * fVar176 + fVar310 * fVar206;
              fVar134 = (fVar178 * fVar176 + fVar237 * fVar310) * fVar176 + fVar310 * fVar209;
              fVar233 = fVar177 * fVar176 + (fVar250 * fVar176 + fVar141 * fVar310) * fVar310;
              fVar236 = fVar179 * fVar176 + (fVar251 * fVar176 + fVar131 * fVar310) * fVar310;
              fVar258 = fVar206 * fVar176 + (fVar252 * fVar176 + fVar132 * fVar310) * fVar310;
              fVar177 = fVar209 * fVar176 + (fVar257 * fVar176 + fVar259 * fVar310) * fVar310;
              fVar253 = fVar176 * fVar134 + fVar310 * fVar177;
              fVar235 = (fVar233 - fVar207) * 3.0;
              fVar263 = (fVar236 - fVar224) * 3.0;
              fVar260 = (fVar258 - fVar226) * 3.0;
              fVar261 = (fVar177 - fVar134) * 3.0;
              fVar134 = fVar176 * 6.0;
              fVar209 = (fVar310 - (fVar176 + fVar176)) * 6.0;
              fVar227 = (fVar176 - (fVar310 + fVar310)) * 6.0;
              fVar206 = fVar310 * 6.0;
              fVar177 = fVar134 * fVar223 +
                        fVar209 * fVar203 + fVar227 * fVar250 + fVar206 * fVar141;
              fVar179 = fVar134 * fVar225 +
                        fVar209 * fVar205 + fVar227 * fVar251 + fVar206 * fVar131;
              fVar134 = fVar134 * fVar232 +
                        fVar209 * fVar234 + fVar227 * fVar252 + fVar206 * fVar132;
              fVar206 = (fVar314 * fVar288 + 0.0) - (fVar176 * fVar207 + fVar310 * fVar233);
              fVar207 = (fVar314 * fVar290 + 0.0) - (fVar176 * fVar224 + fVar310 * fVar236);
              fVar209 = (fVar314 * fVar302 + 0.0) - (fVar176 * fVar226 + fVar310 * fVar258);
              fVar224 = (fVar314 * fVar306 + 0.0) - fVar253;
              fVar176 = fVar207 * fVar207;
              fStack_3d0 = fVar209 * fVar209;
              fStack_3cc = fVar224 * fVar224;
              local_3d8._0_4_ = fVar176 + fVar206 * fVar206 + fStack_3d0;
              local_3d8._4_4_ = fVar176 + fVar176 + fStack_3cc;
              fStack_3d0 = fVar176 + fStack_3d0 + fStack_3d0;
              fStack_3cc = fVar176 + fStack_3cc + fStack_3cc;
              fVar176 = fVar316;
              if (fVar316 <= fVar204) {
                fVar176 = fVar204;
              }
              fVar226 = fVar263 * fVar263 + fVar235 * fVar235 + fVar260 * fVar260;
              auVar75 = ZEXT416((uint)fVar226);
              auVar240 = rsqrtss(ZEXT416((uint)fVar226),auVar75);
              fVar204 = auVar240._0_4_;
              fVar227 = fVar204 * 1.5 - fVar204 * fVar204 * fVar226 * 0.5 * fVar204;
              fVar276 = fVar235 * fVar227;
              fVar283 = fVar263 * fVar227;
              fVar268 = fVar260 * fVar227;
              fVar286 = fVar261 * fVar227;
              fVar266 = fVar260 * fVar134 + fVar263 * fVar179 + fVar235 * fVar177;
              auVar75 = rcpss(auVar75,auVar75);
              fVar204 = (2.0 - fVar226 * auVar75._0_4_) * auVar75._0_4_;
              fVar233 = fVar207 * fVar283;
              fVar236 = fVar209 * fVar268;
              fVar258 = fVar224 * fVar286;
              fVar277 = fVar233 + fVar206 * fVar276 + fVar236;
              fVar284 = fVar233 + fVar233 + fVar258;
              fVar236 = fVar233 + fVar236 + fVar236;
              fVar258 = fVar233 + fVar258 + fVar258;
              fVar271 = (SQRT((float)local_3d8._0_4_) + 1.0) * (fVar316 / SQRT(fVar226)) +
                        SQRT((float)local_3d8._0_4_) * fVar316 + fVar176;
              fVar233 = fVar286 * -fVar261;
              fVar179 = fVar268 * -fVar260 + fVar283 * -fVar263 + fVar276 * -fVar235 +
                        fVar204 * (fVar226 * fVar134 - fVar266 * fVar260) * fVar227 * fVar209 +
                        fVar204 * (fVar226 * fVar179 - fVar266 * fVar263) * fVar227 * fVar207 +
                        fVar204 * (fVar226 * fVar177 - fVar266 * fVar235) * fVar227 * fVar206;
              fVar226 = fVar302 * fVar268 + fVar290 * fVar283 + fVar288 * fVar276;
              fVar134 = (float)local_3d8._0_4_ - fVar277 * fVar277;
              auVar281._0_8_ = CONCAT44((float)local_3d8._4_4_ - fVar284 * fVar284,fVar134);
              auVar281._8_4_ = fStack_3d0 - fVar236 * fVar236;
              auVar281._12_4_ = fStack_3cc - fVar258 * fVar258;
              fVar204 = -fVar261 * fVar224;
              local_568 = CONCAT44(fVar233,fVar179);
              auVar128._8_4_ = auVar281._8_4_;
              auVar128._0_8_ = auVar281._0_8_;
              auVar128._12_4_ = auVar281._12_4_;
              auVar75 = rsqrtss(auVar128,auVar281);
              fVar177 = auVar75._0_4_;
              fVar177 = fVar177 * 1.5 - fVar177 * fVar177 * fVar134 * 0.5 * fVar177;
              if (fVar134 < 0.0) {
                fVar134 = sqrtf(fVar134);
                lVar49 = extraout_RAX_00;
                pRVar54 = extraout_RDX_02;
              }
              else {
                fVar134 = SQRT(fVar134);
              }
              fVar134 = fVar134 - fVar253;
              fVar227 = ((-fVar260 * fVar209 + -fVar263 * fVar207 + -fVar235 * fVar206) -
                        fVar277 * fVar179) * fVar177 - fVar261;
              fVar177 = ((fVar302 * fVar209 + fVar290 * fVar207 + fVar288 * fVar206) -
                        fVar277 * fVar226) * fVar177;
              auVar159._0_4_ = fVar179 * fVar177 - fVar226 * fVar227;
              auVar173._8_4_ = -fVar204;
              auVar173._0_8_ = CONCAT44(fVar204,fVar227) ^ 0x8000000000000000;
              auVar173._12_4_ = fVar306 * fVar224;
              auVar172._8_8_ = auVar173._8_8_;
              auVar172._0_8_ = CONCAT44(fVar177,fVar227) ^ 0x80000000;
              auVar159._4_4_ = auVar159._0_4_;
              auVar159._8_4_ = auVar159._0_4_;
              auVar159._12_4_ = auVar159._0_4_;
              auVar75 = divps(auVar172,auVar159);
              auVar221._8_4_ = fVar233;
              auVar221._0_8_ = local_568;
              auVar221._12_4_ = -(fVar306 * fVar286);
              auVar220._8_8_ = auVar221._8_8_;
              auVar220._0_8_ = CONCAT44(fVar226,fVar179) ^ 0x8000000000000000;
              auVar240 = divps(auVar220,auVar159);
              fVar314 = fVar314 - (fVar134 * auVar240._0_4_ + fVar277 * auVar75._0_4_);
              fVar310 = fVar310 - (fVar134 * auVar240._4_4_ + fVar277 * auVar75._4_4_);
              if ((ABS(fVar277) < fVar271) &&
                 (ABS(fVar134) < auVar198._12_4_ * 1.9073486e-06 + fVar176 + fVar271)) {
                bVar60 = uVar57 < 5;
                fVar314 = local_308._0_4_ + fVar314;
                lVar49 = 0;
                if (((ray->org).field_0.m128[3] <= fVar314) &&
                   (fVar288 = ray->tfar, fVar314 <= fVar288)) {
                  lVar49 = 0;
                  if ((0.0 <= fVar310) && (lVar49 = 0, fVar310 <= 1.0)) {
                    auVar75 = rsqrtss(_local_3d8,_local_3d8);
                    fVar290 = auVar75._0_4_;
                    pGVar9 = (context->scene->geometries).items[(long)pRVar52].ptr;
                    if ((pGVar9->mask & ray->mask) == 0) {
                      lVar49 = 0;
                      pRVar54 = pRVar52;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (lVar49 = CONCAT71((int7)((ulong)context->args >> 8),1),
                            pRVar54 = pRVar52, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0))
                    {
                      fVar290 = fVar290 * 1.5 +
                                fVar290 * fVar290 * (float)local_3d8._0_4_ * -0.5 * fVar290;
                      fVar206 = fVar206 * fVar290;
                      fVar207 = fVar207 * fVar290;
                      fVar209 = fVar209 * fVar290;
                      fVar290 = fVar261 * fVar206 + fVar235;
                      fVar302 = fVar261 * fVar207 + fVar263;
                      fVar306 = fVar261 * fVar209 + fVar260;
                      fVar316 = fVar207 * fVar235 - fVar263 * fVar206;
                      fVar176 = fVar209 * fVar263 - fVar260 * fVar207;
                      fVar134 = fVar206 * fVar260 - fVar235 * fVar209;
                      vu0.field_0._0_8_ =
                           CONCAT44(fVar290 * fVar316 - fVar176 * fVar306,
                                    fVar306 * fVar134 - fVar316 * fVar302);
                      vu0.field_0.v[2] = fVar302 * fVar176 - fVar134 * fVar290;
                      vu0.field_0.v[3] = fVar310;
                      ray->tfar = fVar314;
                      local_54c = -1;
                      args.geometryUserPtr = pGVar9->userPtr;
                      args.valid = &local_54c;
                      args.context = context->user;
                      args.hit = (RTCHitN *)&vu0;
                      args.N = 1;
                      pRVar54 = context;
                      args.ray = (RTCRayN *)ray;
                      if (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00318b8f:
                        p_Var50 = context->args->filter;
                        if ((p_Var50 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var50)(&args);
                          p_Var50 = (RTCFilterFunctionN)args.valid;
                          pRVar54 = extraout_RDX_04;
                          if (*args.valid == 0) goto LAB_00318bdf;
                        }
                        lVar49 = CONCAT71((int7)((ulong)p_Var50 >> 8),1);
                      }
                      else {
                        (*pGVar9->occlusionFilterN)(&args);
                        pRVar54 = extraout_RDX_03;
                        if (*args.valid != 0) goto LAB_00318b8f;
LAB_00318bdf:
                        ray->tfar = fVar288;
                        lVar49 = 0;
                      }
                    }
                  }
                }
                goto LAB_00318967;
              }
            }
            bVar60 = false;
LAB_00318967:
            bVar55 = bVar55 | bVar60 & (byte)lVar49;
            fVar302 = ray->tfar;
            auVar127._0_4_ = -(uint)(fVar262 <= fVar302) & local_348._0_4_;
            auVar127._4_4_ = -(uint)(fVar265 <= fVar302) & local_348._4_4_;
            auVar127._8_4_ = -(uint)(fVar275 <= fVar302) & local_348._8_4_;
            auVar127._12_4_ = -(uint)(fVar282 <= fVar302) & local_348._12_4_;
          }
          auVar202._0_4_ = auVar122._0_4_ & local_328._0_4_ & -(uint)(fVar208 + fVar175 <= fVar302);
          auVar202._4_4_ = auVar122._4_4_ & local_328._4_4_ & -(uint)(fVar208 + fVar267 <= fVar302);
          auVar202._8_4_ = auVar122._8_4_ & (uint)fStack_320 & -(uint)(fVar208 + fVar285 <= fVar302)
          ;
          auVar202._12_4_ =
               auVar122._12_4_ & (uint)fStack_31c & -(uint)(fVar208 + fVar298 <= fVar302);
          auVar102._0_4_ =
               auVar126._0_4_ & auVar155._0_4_ &
               -(uint)(fVar208 + tp1.lower.field_0.v[0] <= fVar302);
          auVar102._4_4_ =
               auVar126._4_4_ & auVar155._4_4_ &
               -(uint)(fVar208 + tp1.lower.field_0.v[1] <= fVar302);
          auVar102._8_4_ =
               auVar126._8_4_ & auVar155._8_4_ &
               -(uint)(fVar208 + tp1.lower.field_0.v[2] <= fVar302);
          auVar102._12_4_ =
               auVar126._12_4_ & auVar155._12_4_ &
               -(uint)(fVar208 + tp1.lower.field_0.v[3] <= fVar302);
          uVar61 = movmskps(0,auVar102 | auVar202);
          uVar57 = (ulong)uVar61;
          if (uVar61 != 0) {
            uVar57 = (long)pRVar53 * 0x30;
            stack[(long)pRVar53].valid.field_0 =
                 (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar102 | auVar202);
            stack[(long)pRVar53].tlower.field_0.i[0] =
                 ~auVar202._0_4_ & tp1.lower.field_0.i[0] | (uint)fVar175 & auVar202._0_4_;
            stack[(long)pRVar53].tlower.field_0.i[1] =
                 ~auVar202._4_4_ & tp1.lower.field_0.i[1] | (uint)fVar267 & auVar202._4_4_;
            stack[(long)pRVar53].tlower.field_0.i[2] =
                 ~auVar202._8_4_ & tp1.lower.field_0.i[2] | (uint)fVar285 & auVar202._8_4_;
            stack[(long)pRVar53].tlower.field_0.i[3] =
                 ~auVar202._12_4_ & tp1.lower.field_0.i[3] | (uint)fVar298 & auVar202._12_4_;
            stack[(long)pRVar53].u0 = fVar142;
            stack[(long)pRVar53].u1 = fVar161;
            stack[(long)pRVar53].depth = local_61c + 1;
            pRVar53 = (RayQueryContext *)(ulong)((int)pRVar53 + 1);
          }
        }
      }
    }
    fVar142 = ray->tfar;
    do {
      pRVar56 = pRVar53;
      iVar45 = (int)pRVar56;
      if (iVar45 == 0) {
        if (bVar55 != 0) goto LAB_00318e6e;
        auVar104._4_4_ = -(uint)(fVar107 <= fVar142);
        auVar104._0_4_ = -(uint)(fVar66 <= fVar142);
        auVar104._8_4_ = -(uint)(fVar108 <= fVar142);
        auVar104._12_4_ = -(uint)(fVar109 <= fVar142);
        uVar61 = movmskps((int)uVar57,auVar104);
        uVar61 = (uint)uVar58 & uVar61;
        goto LAB_00316911;
      }
      pRVar53 = (RayQueryContext *)(ulong)(iVar45 - 1U);
      uVar57 = (long)pRVar53 * 0x30;
      fVar161 = stack[(long)pRVar53].tlower.field_0.v[0];
      fVar175 = stack[(long)pRVar53].tlower.field_0.v[1];
      fVar262 = stack[(long)pRVar53].tlower.field_0.v[2];
      fVar265 = stack[(long)pRVar53].tlower.field_0.v[3];
      args.valid._0_4_ =
           -(uint)(fVar208 + fVar161 <= fVar142) & stack[(long)pRVar53].valid.field_0.i[0];
      args.valid._4_4_ =
           -(uint)(fVar208 + fVar175 <= fVar142) & stack[(long)pRVar53].valid.field_0.i[1];
      args.geometryUserPtr._0_4_ =
           -(uint)(fVar208 + fVar262 <= fVar142) & stack[(long)pRVar53].valid.field_0.i[2];
      args.geometryUserPtr._4_4_ =
           -(uint)(fVar208 + fVar265 <= fVar142) & stack[(long)pRVar53].valid.field_0.i[3];
      uVar61 = movmskps((int)pRVar54,(undefined1  [16])args._0_16_);
      pRVar54 = (RayQueryContext *)(ulong)uVar61;
    } while (uVar61 == 0);
    auVar138._0_4_ = (uint)fVar161 & (uint)args.valid;
    auVar138._4_4_ = (uint)fVar175 & args.valid._4_4_;
    auVar138._8_4_ = (uint)fVar262 & (uint)args.geometryUserPtr;
    auVar138._12_4_ = (uint)fVar265 & args.geometryUserPtr._4_4_;
    auVar160._0_8_ = CONCAT44(~args.valid._4_4_,~(uint)args.valid) & 0x7f8000007f800000;
    auVar160._8_4_ = ~(uint)args.geometryUserPtr & 0x7f800000;
    auVar160._12_4_ = ~args.geometryUserPtr._4_4_ & 0x7f800000;
    auVar160 = auVar160 | auVar138;
    auVar139._4_4_ = auVar160._0_4_;
    auVar139._0_4_ = auVar160._4_4_;
    auVar139._8_4_ = auVar160._12_4_;
    auVar139._12_4_ = auVar160._8_4_;
    auVar75 = minps(auVar139,auVar160);
    auVar129._0_8_ = auVar75._8_8_;
    auVar129._8_4_ = auVar75._0_4_;
    auVar129._12_4_ = auVar75._4_4_;
    auVar75 = minps(auVar129,auVar75);
    auVar130._0_8_ =
         CONCAT44(-(uint)(auVar75._4_4_ == auVar160._4_4_) & args.valid._4_4_,
                  -(uint)(auVar75._0_4_ == auVar160._0_4_) & (uint)args.valid);
    auVar130._8_4_ = -(uint)(auVar75._8_4_ == auVar160._8_4_) & (uint)args.geometryUserPtr;
    auVar130._12_4_ = -(uint)(auVar75._12_4_ == auVar160._12_4_) & args.geometryUserPtr._4_4_;
    iVar51 = movmskps(iVar45 - 1U,auVar130);
    auVar103 = (undefined1  [16])args._0_16_;
    if (iVar51 != 0) {
      auVar103._8_4_ = auVar130._8_4_;
      auVar103._0_8_ = auVar130._0_8_;
      auVar103._12_4_ = auVar130._12_4_;
    }
    pSVar48 = stack + (long)pRVar53;
    uVar61 = movmskps(iVar51,auVar103);
    lVar49 = 0;
    if (uVar61 != 0) {
      for (; (uVar61 >> lVar49 & 1) == 0; lVar49 = lVar49 + 1) {
      }
    }
    *(undefined4 *)(local_518 + lVar49 * 4 + -0x30) = 0;
    uVar6 = stack[(long)pRVar53].u0;
    uVar7 = stack[(long)pRVar53].u1;
    local_61c = stack[(long)pRVar53].depth;
    iVar51 = movmskps(local_61c,(undefined1  [16])args._0_16_);
    pRVar54 = (RayQueryContext *)(ulong)(iVar45 - 1);
    if (iVar51 != 0) {
      pRVar54 = pRVar56;
    }
    (pSVar48->valid).field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)args._0_16_;
    fVar142 = (float)uVar7 - (float)uVar6;
    vu0.field_0.v[1] = fVar142 * 0.33333334 + (float)uVar6;
    vu0.field_0.v[0] = fVar142 * 0.0 + (float)uVar6;
    vu0.field_0.v[2] = fVar142 * 0.6666667 + (float)uVar6;
    vu0.field_0.v[3] = fVar142 * 1.0 + (float)uVar6;
    fVar142 = vu0.field_0.v[lVar49];
    fVar161 = *(float *)((long)&vu0.field_0 + lVar49 * 4 + 4);
    pRVar53 = pRVar54;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }